

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [16];
  undefined1 auVar25 [14];
  undefined1 auVar26 [12];
  unkbyte10 Var27;
  undefined1 auVar28 [12];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  long lVar32;
  long lVar33;
  Scene *pSVar34;
  RTCRayN *pRVar35;
  RTCFilterFunctionN p_Var36;
  int iVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  int iVar61;
  byte bVar62;
  char cVar63;
  byte bVar94;
  byte bVar96;
  char cVar98;
  char cVar99;
  char cVar100;
  char cVar101;
  byte bVar103;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  char cVar95;
  char cVar97;
  undefined1 auVar71 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar93;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint uVar149;
  uint uVar165;
  uint uVar166;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar167;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar168;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar176;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar177;
  float fVar178;
  float fVar185;
  float fVar186;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar187;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar188;
  float fVar198;
  float fVar199;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar202;
  float fVar203;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar212;
  float fVar213;
  float fVar217;
  float fVar218;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar255;
  undefined1 auVar254 [16];
  UVIdentity<4> mapUV;
  float fStack_14ac;
  undefined1 local_14a8 [8];
  float fStack_14a0;
  float fStack_149c;
  float local_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  undefined8 local_1488;
  float fStack_1480;
  float fStack_147c;
  float fStack_1460;
  float fStack_145c;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  vbool<4> valid;
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  RTCFilterFunctionNArguments args;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1340;
  float fStack_133c;
  vint<4> sy;
  vfloat<4> tNear;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  float local_1298 [4];
  float local_1288 [4];
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  undefined1 local_1268 [16];
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  StackItemT<embree::NodeRefPtr<4>_> *local_1220;
  ulong local_1218;
  ulong local_1210;
  ulong local_1208;
  ulong local_1200;
  ulong local_11f8;
  ulong local_11f0;
  long local_11e8;
  long local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  long local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  vint<4> sx;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [8];
  float fStack_1110;
  float fStack_110c;
  undefined4 local_1108;
  undefined4 uStack_1104;
  undefined4 uStack_1100;
  undefined4 uStack_10fc;
  undefined1 local_10f8 [16];
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  uint local_10c8;
  uint uStack_10c4;
  uint uStack_10c0;
  uint uStack_10bc;
  uint local_10b8;
  uint uStack_10b4;
  uint uStack_10b0;
  uint uStack_10ac;
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined8 local_1038;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar72 [16];
  undefined1 auVar64 [11];
  undefined1 auVar73 [16];
  undefined1 auVar79 [16];
  undefined1 auVar65 [12];
  undefined1 auVar74 [16];
  undefined1 auVar66 [13];
  undefined1 auVar75 [16];
  undefined1 auVar80 [16];
  undefined1 auVar77 [16];
  undefined1 auVar76 [16];
  undefined2 uVar102;
  
  local_1220 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar126 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar203 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar212 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar177 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar230 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar202 = fVar212 * 0.99999964;
  fVar251 = fVar177 * 0.99999964;
  fVar234 = fVar230 * 0.99999964;
  fVar212 = fVar212 * 1.0000004;
  fVar177 = fVar177 * 1.0000004;
  fVar230 = fVar230 * 1.0000004;
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar46 = uVar42 ^ 0x10;
  uVar40 = uVar44 ^ 0x10;
  iVar37 = (tray->tnear).field_0.i[k];
  auVar205._4_4_ = iVar37;
  auVar205._0_4_ = iVar37;
  auVar205._8_4_ = iVar37;
  auVar205._12_4_ = iVar37;
  iVar37 = (tray->tfar).field_0.i[k];
  auVar191._4_4_ = iVar37;
  auVar191._0_4_ = iVar37;
  auVar191._8_4_ = iVar37;
  auVar191._12_4_ = iVar37;
  local_11f0 = uVar42 >> 2;
  local_11f8 = uVar46 >> 2;
  local_1200 = uVar44 >> 2;
  local_1208 = uVar40 >> 2;
  local_1210 = uVar47 >> 2;
  lVar32 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_11a0 = uVar47 ^ 0x10;
  local_1218 = (uVar47 ^ 0x10) >> 2;
  local_1278 = fVar126;
  fStack_1274 = fVar126;
  fStack_1270 = fVar126;
  fStack_126c = fVar126;
  local_1098 = fVar251;
  fStack_1094 = fVar251;
  fStack_1090 = fVar251;
  fStack_108c = fVar251;
  local_11b8 = uVar42;
  local_11c0 = uVar44;
  local_11c8 = uVar47;
  local_11d0 = uVar46;
  local_1068 = fVar203;
  fStack_1064 = fVar203;
  fStack_1060 = fVar203;
  fStack_105c = fVar203;
  local_1178 = fVar212;
  fStack_1174 = fVar212;
  fStack_1170 = fVar212;
  fStack_116c = fVar212;
  local_1188 = fVar177;
  fStack_1184 = fVar177;
  fStack_1180 = fVar177;
  fStack_117c = fVar177;
  local_1078 = fVar230;
  fStack_1074 = fVar230;
  fStack_1070 = fVar230;
  fStack_106c = fVar230;
  local_1088 = fVar234;
  fStack_1084 = fVar234;
  fStack_1080 = fVar234;
  fStack_107c = fVar234;
  local_1198 = fVar202;
  fStack_1194 = fVar202;
  fStack_1190 = fVar202;
  fStack_118c = fVar202;
  local_11d8 = uVar40;
  local_10a8 = auVar205;
  fVar188 = fVar126;
  fVar199 = fVar126;
  fVar252 = fVar126;
  fVar217 = fVar251;
  fVar213 = fVar251;
  fVar187 = fVar251;
  fVar186 = fVar230;
  fVar185 = fVar230;
  fVar178 = fVar230;
  fVar176 = fVar203;
  fVar175 = fVar203;
  fVar174 = fVar203;
  fVar168 = fVar212;
  fVar210 = fVar212;
  fVar209 = fVar212;
  fVar248 = fVar202;
  fVar245 = fVar202;
  fVar200 = fVar202;
  fVar201 = fVar177;
  fVar229 = fVar177;
  fVar198 = fVar177;
  fVar224 = fVar234;
  fVar221 = fVar234;
  fVar211 = fVar234;
LAB_002137d5:
  do {
    pSVar29 = local_1220 + -1;
    local_1220 = local_1220 + -1;
    if ((float)pSVar29->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar29->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar45 = (local_1220->ptr).ptr;
      while ((uVar45 & 8) == 0) {
        pfVar5 = (float *)(uVar45 + 0x20 + uVar42);
        auVar67._0_4_ = (*pfVar5 - fVar126) * fVar200;
        auVar67._4_4_ = (pfVar5[1] - fVar188) * fVar245;
        auVar67._8_4_ = (pfVar5[2] - fVar199) * fVar248;
        auVar67._12_4_ = (pfVar5[3] - fVar252) * fVar202;
        pfVar5 = (float *)(uVar45 + 0x20 + uVar44);
        auVar128._0_4_ = (*pfVar5 - fVar6) * fVar187;
        auVar128._4_4_ = (pfVar5[1] - fVar6) * fVar213;
        auVar128._8_4_ = (pfVar5[2] - fVar6) * fVar217;
        auVar128._12_4_ = (pfVar5[3] - fVar6) * fVar251;
        auVar67 = maxps(auVar67,auVar128);
        pfVar5 = (float *)(uVar45 + 0x20 + uVar47);
        auVar180._0_4_ = (*pfVar5 - fVar174) * fVar211;
        auVar180._4_4_ = (pfVar5[1] - fVar175) * fVar221;
        auVar180._8_4_ = (pfVar5[2] - fVar176) * fVar224;
        auVar180._12_4_ = (pfVar5[3] - fVar203) * fVar234;
        pfVar5 = (float *)(uVar45 + 0x20 + uVar46);
        auVar127._0_4_ = (*pfVar5 - fVar126) * fVar209;
        auVar127._4_4_ = (pfVar5[1] - fVar188) * fVar210;
        auVar127._8_4_ = (pfVar5[2] - fVar199) * fVar168;
        auVar127._12_4_ = (pfVar5[3] - fVar252) * fVar212;
        pfVar5 = (float *)(uVar45 + 0x20 + uVar40);
        auVar150._0_4_ = (*pfVar5 - fVar6) * fVar198;
        auVar150._4_4_ = (pfVar5[1] - fVar6) * fVar229;
        auVar150._8_4_ = (pfVar5[2] - fVar6) * fVar201;
        auVar150._12_4_ = (pfVar5[3] - fVar6) * fVar177;
        auVar128 = minps(auVar127,auVar150);
        pfVar5 = (float *)(uVar45 + 0x20 + local_11a0);
        auVar151._0_4_ = (*pfVar5 - fVar174) * fVar178;
        auVar151._4_4_ = (pfVar5[1] - fVar175) * fVar185;
        auVar151._8_4_ = (pfVar5[2] - fVar176) * fVar186;
        auVar151._12_4_ = (pfVar5[3] - fVar203) * fVar230;
        auVar104 = maxps(auVar180,auVar205);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar67,auVar104);
        auVar67 = minps(auVar151,auVar191);
        auVar67 = minps(auVar128,auVar67);
        auVar104._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar67._4_4_);
        auVar104._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar67._0_4_);
        auVar104._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar67._8_4_);
        auVar104._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar67._12_4_);
        uVar39 = movmskps((int)local_11a0,auVar104);
        if (uVar39 == 0) {
          if (local_1220 == stack) {
            return;
          }
          goto LAB_002137d5;
        }
        uVar39 = uVar39 & 0xff;
        uVar38 = uVar45 & 0xfffffffffffffff0;
        lVar33 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
          }
        }
        uVar45 = *(ulong *)(uVar38 + lVar33 * 8);
        uVar39 = uVar39 - 1 & uVar39;
        if (uVar39 != 0) {
          uVar9 = tNear.field_0.i[lVar33];
          lVar33 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar38 + lVar33 * 8);
          uVar149 = tNear.field_0.i[lVar33];
          uVar39 = uVar39 - 1 & uVar39;
          if (uVar39 == 0) {
            if (uVar9 < uVar149) {
              (local_1220->ptr).ptr = uVar10;
              local_1220->dist = uVar149;
              local_1220 = local_1220 + 1;
            }
            else {
              (local_1220->ptr).ptr = uVar45;
              local_1220->dist = uVar9;
              local_1220 = local_1220 + 1;
              uVar45 = uVar10;
            }
          }
          else {
            auVar68._8_4_ = uVar9;
            auVar68._0_8_ = uVar45;
            auVar68._12_4_ = 0;
            auVar105._8_4_ = uVar149;
            auVar105._0_8_ = uVar10;
            auVar105._12_4_ = 0;
            lVar33 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
              }
            }
            uVar45 = *(ulong *)(uVar38 + lVar33 * 8);
            iVar37 = tNear.field_0.i[lVar33];
            auVar129._8_4_ = iVar37;
            auVar129._0_8_ = uVar45;
            auVar129._12_4_ = 0;
            auVar152._8_4_ = -(uint)((int)uVar9 < (int)uVar149);
            uVar39 = uVar39 - 1 & uVar39;
            if (uVar39 == 0) {
              auVar152._4_4_ = auVar152._8_4_;
              auVar152._0_4_ = auVar152._8_4_;
              auVar152._12_4_ = auVar152._8_4_;
              auVar67 = auVar68 & auVar152 | ~auVar152 & auVar105;
              auVar104 = auVar105 & auVar152 | ~auVar152 & auVar68;
              auVar153._8_4_ = -(uint)(auVar67._8_4_ < iVar37);
              auVar153._0_8_ = CONCAT44(auVar153._8_4_,auVar153._8_4_);
              auVar153._12_4_ = auVar153._8_4_;
              uVar45 = ~auVar153._0_8_ & uVar45 | auVar67._0_8_ & auVar153._0_8_;
              auVar67 = auVar129 & auVar153 | ~auVar153 & auVar67;
              auVar69._8_4_ = -(uint)(auVar104._8_4_ < auVar67._8_4_);
              auVar69._4_4_ = auVar69._8_4_;
              auVar69._0_4_ = auVar69._8_4_;
              auVar69._12_4_ = auVar69._8_4_;
              *local_1220 = (StackItemT<embree::NodeRefPtr<4>_>)
                            (~auVar69 & auVar104 | auVar67 & auVar69);
              local_1220[1] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(auVar104 & auVar69 | ~auVar69 & auVar67);
              local_1220 = local_1220 + 2;
            }
            else {
              lVar33 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                }
              }
              iVar53 = tNear.field_0.i[lVar33];
              auVar169._8_4_ = iVar53;
              auVar169._0_8_ = *(undefined8 *)(uVar38 + lVar33 * 8);
              auVar169._12_4_ = 0;
              auVar154._4_4_ = auVar152._8_4_;
              auVar154._0_4_ = auVar152._8_4_;
              auVar154._8_4_ = auVar152._8_4_;
              auVar154._12_4_ = auVar152._8_4_;
              local_1268 = auVar191;
              auVar191 = auVar68 & auVar154 | ~auVar154 & auVar105;
              auVar67 = auVar105 & auVar154 | ~auVar154 & auVar68;
              auVar179._0_4_ = -(uint)(iVar37 < iVar53);
              auVar179._4_4_ = -(uint)(iVar37 < iVar53);
              auVar179._8_4_ = -(uint)(iVar37 < iVar53);
              auVar179._12_4_ = -(uint)(iVar37 < iVar53);
              auVar104 = auVar129 & auVar179 | ~auVar179 & auVar169;
              auVar180 = ~auVar179 & auVar129 | auVar169 & auVar179;
              auVar130._8_4_ = -(uint)(auVar67._8_4_ < auVar180._8_4_);
              auVar130._4_4_ = auVar130._8_4_;
              auVar130._0_4_ = auVar130._8_4_;
              auVar130._12_4_ = auVar130._8_4_;
              auVar128 = auVar67 & auVar130 | ~auVar130 & auVar180;
              auVar106._8_4_ = -(uint)(auVar191._8_4_ < auVar104._8_4_);
              auVar106._0_8_ = CONCAT44(auVar106._8_4_,auVar106._8_4_);
              auVar106._12_4_ = auVar106._8_4_;
              uVar45 = auVar191._0_8_ & auVar106._0_8_ | ~auVar106._0_8_ & auVar104._0_8_;
              auVar191 = ~auVar106 & auVar191 | auVar104 & auVar106;
              auVar70._8_4_ = -(uint)(auVar191._8_4_ < auVar128._8_4_);
              auVar70._4_4_ = auVar70._8_4_;
              auVar70._0_4_ = auVar70._8_4_;
              auVar70._12_4_ = auVar70._8_4_;
              *local_1220 = (StackItemT<embree::NodeRefPtr<4>_>)
                            (~auVar130 & auVar67 | auVar180 & auVar130);
              local_1220[1] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(~auVar70 & auVar191 | auVar128 & auVar70);
              local_1220[2] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(auVar191 & auVar70 | ~auVar70 & auVar128);
              local_1220 = local_1220 + 3;
              auVar191 = local_1268;
              fVar126 = local_1278;
              fVar188 = fStack_1274;
              fVar199 = fStack_1270;
              fVar252 = fStack_126c;
            }
          }
        }
      }
      local_11e8 = (ulong)((uint)uVar45 & 0xf) - 8;
      if (local_11e8 != 0) {
        uVar45 = uVar45 & 0xfffffffffffffff0;
        local_11e0 = 0;
        local_1268 = auVar191;
        do {
          lVar33 = local_11e0 * 0x58;
          local_11b0 = uVar45 + lVar33;
          uVar8 = *(undefined8 *)(uVar45 + 0x20 + lVar33);
          uVar30 = *(undefined4 *)(uVar45 + 0x24 + lVar33);
          bVar103 = (byte)uVar8;
          bVar62 = (byte)uVar30;
          bVar14 = (byte)((ulong)uVar8 >> 8);
          bVar94 = (byte)((uint)uVar30 >> 8);
          bVar15 = (byte)((ulong)uVar8 >> 0x10);
          bVar96 = (byte)((uint)uVar30 >> 0x10);
          bVar17 = (byte)((uint)uVar30 >> 0x18);
          bVar16 = (byte)((ulong)uVar8 >> 0x18);
          cVar63 = -((byte)((bVar103 < bVar62) * bVar103 | (bVar103 >= bVar62) * bVar62) == bVar103)
          ;
          cVar95 = -((byte)((bVar14 < bVar94) * bVar14 | (bVar14 >= bVar94) * bVar94) == bVar14);
          cVar97 = -((byte)((bVar15 < bVar96) * bVar15 | (bVar15 >= bVar96) * bVar96) == bVar15);
          cVar98 = -((byte)((bVar16 < bVar17) * bVar16 | (bVar16 >= bVar17) * bVar17) == bVar16);
          cVar99 = -((char)((ulong)uVar8 >> 0x20) == '\0');
          cVar100 = -((char)((ulong)uVar8 >> 0x28) == '\0');
          cVar101 = -((char)((ulong)uVar8 >> 0x30) == '\0');
          bVar103 = -((char)((ulong)uVar8 >> 0x38) == '\0');
          auVar72._0_9_ = CONCAT18(0xff,(ulong)bVar103 << 0x38);
          auVar64._0_10_ = CONCAT19(0xff,auVar72._0_9_);
          auVar64[10] = 0xff;
          auVar65[0xb] = 0xff;
          auVar65._0_11_ = auVar64;
          auVar66[0xc] = 0xff;
          auVar66._0_12_ = auVar65;
          auVar77[0xd] = 0xff;
          auVar77._0_13_ = auVar66;
          fVar126 = *(float *)(uVar45 + 0x38 + lVar33);
          fVar212 = *(float *)(uVar45 + 0x3c + lVar33);
          fVar177 = *(float *)(uVar45 + 0x44 + lVar33);
          uVar39 = *(uint *)(local_11f0 + 0x20 + local_11b0);
          auVar23[0xc] = (char)(uVar39 >> 0x18);
          auVar23._0_12_ = ZEXT712(0);
          uVar9 = *(uint *)(local_11f8 + 0x20 + local_11b0);
          auVar18[0xc] = (char)(uVar9 >> 0x18);
          auVar18._0_12_ = ZEXT712(0);
          fVar188 = *(float *)(uVar45 + 0x48 + lVar33);
          uVar149 = *(uint *)(local_1200 + 0x20 + local_11b0);
          auVar19[0xc] = (char)(uVar149 >> 0x18);
          auVar19._0_12_ = ZEXT712(0);
          uVar165 = *(uint *)(local_1208 + 0x20 + local_11b0);
          auVar20[0xc] = (char)(uVar165 >> 0x18);
          auVar20._0_12_ = ZEXT712(0);
          fVar199 = *(float *)(uVar45 + 0x4c + lVar33);
          uVar166 = *(uint *)(local_1210 + 0x20 + local_11b0);
          auVar21[0xc] = (char)(uVar166 >> 0x18);
          auVar21._0_12_ = ZEXT712(0);
          uVar167 = *(uint *)(local_1218 + 0x20 + local_11b0);
          auVar22[0xc] = (char)(uVar167 >> 0x18);
          auVar22._0_12_ = ZEXT712(0);
          fVar252 = *(float *)(uVar45 + 0x40 + lVar33);
          auVar107._0_4_ = (((float)(uVar39 & 0xff) * fVar177 + fVar126) - local_1278) * local_1198;
          auVar107._4_4_ =
               (((float)(uVar39 >> 8 & 0xff) * fVar177 + fVar126) - fStack_1274) * fStack_1194;
          auVar107._8_4_ =
               (((float)(int)CONCAT32(auVar23._10_3_,(ushort)(byte)(uVar39 >> 0x10)) * fVar177 +
                fVar126) - fStack_1270) * fStack_1190;
          auVar107._12_4_ =
               (((float)(uint3)(auVar23._10_3_ >> 0x10) * fVar177 + fVar126) - fStack_126c) *
               fStack_118c;
          auVar170._0_4_ = (((float)(uVar149 & 0xff) * fVar188 + fVar212) - fVar6) * fVar187;
          auVar170._4_4_ = (((float)(uVar149 >> 8 & 0xff) * fVar188 + fVar212) - fVar6) * fVar213;
          auVar170._8_4_ =
               (((float)(int)CONCAT32(auVar19._10_3_,(ushort)(byte)(uVar149 >> 0x10)) * fVar188 +
                fVar212) - fVar6) * fVar217;
          auVar170._12_4_ =
               (((float)(uint3)(auVar19._10_3_ >> 0x10) * fVar188 + fVar212) - fVar6) * fVar251;
          auVar67 = maxps(auVar107,auVar170);
          auVar131._0_4_ = (((float)(uVar9 & 0xff) * fVar177 + fVar126) - local_1278) * local_1178;
          auVar131._4_4_ =
               (((float)(uVar9 >> 8 & 0xff) * fVar177 + fVar126) - fStack_1274) * fStack_1174;
          auVar131._8_4_ =
               (((float)(int)CONCAT32(auVar18._10_3_,(ushort)(byte)(uVar9 >> 0x10)) * fVar177 +
                fVar126) - fStack_1270) * fStack_1170;
          auVar131._12_4_ =
               (((float)(uint3)(auVar18._10_3_ >> 0x10) * fVar177 + fVar126) - fStack_126c) *
               fStack_116c;
          auVar155._0_4_ = (((float)(uVar165 & 0xff) * fVar188 + fVar212) - fVar6) * local_1188;
          auVar155._4_4_ =
               (((float)(uVar165 >> 8 & 0xff) * fVar188 + fVar212) - fVar6) * fStack_1184;
          auVar155._8_4_ =
               (((float)(int)CONCAT32(auVar20._10_3_,(ushort)(byte)(uVar165 >> 0x10)) * fVar188 +
                fVar212) - fVar6) * fStack_1180;
          auVar155._12_4_ =
               (((float)(uint3)(auVar20._10_3_ >> 0x10) * fVar188 + fVar212) - fVar6) * fStack_117c;
          auVar104 = minps(auVar131,auVar155);
          auVar181._0_4_ = (((float)(uVar166 & 0xff) * fVar199 + fVar252) - fVar174) * fVar211;
          auVar181._4_4_ = (((float)(uVar166 >> 8 & 0xff) * fVar199 + fVar252) - fVar175) * fVar221;
          auVar181._8_4_ =
               (((float)(int)CONCAT32(auVar21._10_3_,(ushort)(byte)(uVar166 >> 0x10)) * fVar199 +
                fVar252) - fVar176) * fVar224;
          auVar181._12_4_ =
               (((float)(uint3)(auVar21._10_3_ >> 0x10) * fVar199 + fVar252) - fVar203) * fVar234;
          auVar128 = maxps(auVar181,auVar205);
          dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar67,auVar128);
          auVar189._0_4_ = (((float)(uVar167 & 0xff) * fVar199 + fVar252) - fVar174) * fVar178;
          auVar189._4_4_ = (((float)(uVar167 >> 8 & 0xff) * fVar199 + fVar252) - fVar175) * fVar185;
          auVar189._8_4_ =
               (((float)(int)CONCAT32(auVar22._10_3_,(ushort)(byte)(uVar167 >> 0x10)) * fVar199 +
                fVar252) - fVar176) * fVar186;
          auVar189._12_4_ =
               (((float)(uint3)(auVar22._10_3_ >> 0x10) * fVar199 + fVar252) - fVar203) * fVar230;
          auVar67 = minps(auVar189,auVar191);
          auVar67 = minps(auVar104,auVar67);
          auVar77[0xe] = bVar103;
          auVar77[0xf] = bVar103;
          auVar76._14_2_ = auVar77._14_2_;
          auVar76[0xd] = cVar101;
          auVar76._0_13_ = auVar66;
          auVar75._13_3_ = auVar76._13_3_;
          auVar75[0xc] = cVar101;
          auVar75._0_12_ = auVar65;
          auVar74._12_4_ = auVar75._12_4_;
          auVar74[0xb] = cVar100;
          auVar74._0_11_ = auVar64;
          auVar73._11_5_ = auVar74._11_5_;
          auVar73[10] = cVar100;
          auVar73._0_10_ = auVar64._0_10_;
          auVar72._10_6_ = auVar73._10_6_;
          auVar72[9] = cVar99;
          Var27 = CONCAT91(CONCAT81((long)(CONCAT72(auVar72._9_7_,CONCAT11(cVar99,bVar103)) >> 8),
                                    cVar98),cVar98);
          auVar26._2_10_ = Var27;
          auVar26[1] = cVar97;
          auVar26[0] = cVar97;
          auVar25._2_12_ = auVar26;
          auVar25[1] = cVar95;
          auVar25[0] = cVar95;
          auVar71._0_2_ = CONCAT11(cVar63,cVar63);
          auVar71._2_14_ = auVar25;
          uVar102 = (undefined2)Var27;
          auVar80._0_12_ = auVar71._0_12_;
          auVar80._12_2_ = uVar102;
          auVar80._14_2_ = uVar102;
          auVar79._12_4_ = auVar80._12_4_;
          auVar79._0_10_ = auVar71._0_10_;
          auVar79._10_2_ = auVar26._0_2_;
          auVar78._10_6_ = auVar79._10_6_;
          auVar78._0_8_ = auVar71._0_8_;
          auVar78._8_2_ = auVar26._0_2_;
          auVar28._4_8_ = auVar78._8_8_;
          auVar28._2_2_ = auVar25._0_2_;
          auVar28._0_2_ = auVar25._0_2_;
          uVar39 = CONCAT22(auVar71._0_2_,auVar71._0_2_);
          auVar108._0_4_ = -(uint)(dist.field_0._0_4_ <= auVar67._0_4_) & uVar39;
          auVar108._4_4_ = -(uint)(dist.field_0._4_4_ <= auVar67._4_4_) & auVar28._0_4_;
          auVar108._8_4_ = -(uint)(dist.field_0._8_4_ <= auVar67._8_4_) & auVar78._8_4_;
          auVar108._12_4_ = -(uint)(dist.field_0._12_4_ <= auVar67._12_4_) & auVar79._12_4_;
          uVar39 = movmskps((int)lVar33,auVar108);
          if (uVar39 != 0) {
            local_11a8 = (ulong)(uVar39 & 0xff);
            do {
              lVar33 = 0;
              if (local_11a8 != 0) {
                for (; (local_11a8 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                }
              }
              fVar126 = *(float *)(ray + k * 4 + 0x80);
              if (*(float *)((long)&stack[-1].ptr.ptr + lVar33 * 4) <= fVar126) {
                uVar39 = *(uint *)(local_11b0 + 0x50);
                local_1428._0_8_ = CONCAT44(0,uVar39);
                uVar9 = *(uint *)(local_11b0 + 4 + lVar33 * 8);
                pSVar34 = context->scene;
                pGVar11 = (pSVar34->geometries).items[local_1428._0_8_].ptr;
                lVar12 = *(long *)&pGVar11->field_0x58;
                lVar13 = *(long *)&pGVar11[1].time_range.upper;
                lVar41 = (ulong)uVar9 *
                         pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i;
                uVar40 = *(ulong *)(local_11b0 + lVar33 * 8);
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uVar40;
                uVar42 = *(ulong *)(lVar12 + lVar41);
                uVar44 = (ulong)((int)((ulong)(SUB164(auVar81 & _DAT_01fab9a0,0) >> 0x10) *
                                      (uVar42 >> 0x20)) +
                                (int)uVar42 + (uint)SUB162(auVar81 & _DAT_01fab9a0,0));
                p_Var36 = pGVar11[1].intersectionFilterN;
                pfVar5 = (float *)(lVar13 + (long)p_Var36 * uVar44);
                pfVar1 = (float *)(lVar13 + (uVar44 + 1) * (long)p_Var36);
                local_1048 = pfVar1[1];
                fVar203 = pfVar1[2];
                uVar42 = uVar42 >> 0x20;
                lVar33 = uVar44 + uVar42 + 1;
                pfVar2 = (float *)(lVar13 + (uVar44 + uVar42) * (long)p_Var36);
                fVar212 = *pfVar2;
                local_1058 = pfVar2[1];
                local_1498 = pfVar2[2];
                pfVar2 = (float *)(lVar13 + lVar33 * (long)p_Var36);
                fVar177 = *pfVar2;
                fVar188 = pfVar2[1];
                fVar199 = pfVar2[2];
                uVar46 = (ulong)(-1 < (short)uVar40);
                pfVar2 = (float *)(lVar13 + (uVar44 + uVar46 + 1) * (long)p_Var36);
                fVar230 = pfVar2[2];
                lVar43 = uVar46 + lVar33;
                pfVar3 = (float *)(lVar13 + lVar43 * (long)p_Var36);
                fVar252 = *pfVar3;
                fVar198 = pfVar3[1];
                fVar229 = pfVar3[2];
                uVar46 = 0;
                if (-1 < (short)(uVar40 >> 0x10)) {
                  uVar46 = uVar42;
                }
                pfVar3 = (float *)(lVar13 + (uVar44 + uVar42 + uVar46) * (long)p_Var36);
                pfVar4 = (float *)(lVar13 + (lVar33 + uVar46) * (long)p_Var36);
                fVar201 = pfVar4[1];
                fVar200 = *(float *)(lVar13 + (uVar46 + lVar43) * (long)p_Var36 + 4);
                fVar211 = *(float *)(ray + k * 4);
                local_f98 = *pfVar5 - fVar211;
                fStack_f94 = *pfVar1 - fVar211;
                fStack_f90 = fVar177 - fVar211;
                fStack_f8c = fVar212 - fVar211;
                fStack_1228 = fVar252;
                fStack_1224 = fVar177;
                fVar219 = *pfVar1 - fVar211;
                fVar222 = *pfVar2 - fVar211;
                fVar225 = fVar252 - fVar211;
                fVar227 = fVar177 - fVar211;
                local_1248 = CONCAT44(fVar177,fVar212);
                local_1238 = *pfVar4;
                fStack_1234 = *pfVar3;
                fVar212 = fVar212 - fVar211;
                fVar209 = fVar177 - fVar211;
                fVar210 = *pfVar4 - fVar211;
                fVar211 = *pfVar3 - fVar211;
                fVar221 = *(float *)(ray + k * 4 + 0x10);
                fVar224 = *(float *)(ray + k * 4 + 0x20);
                local_fa8 = pfVar5[1] - fVar221;
                fStack_fa4 = local_1048 - fVar221;
                fStack_fa0 = fVar188 - fVar221;
                fStack_f9c = local_1058 - fVar221;
                local_1258._0_4_ = pfVar5[2] - fVar224;
                local_1258._4_4_ = fVar203 - fVar224;
                fStack_1250 = fVar199 - fVar224;
                fStack_124c = local_1498 - fVar224;
                fStack_1054 = fVar188;
                fStack_1050 = fVar201;
                fStack_104c = pfVar3[1];
                local_1458 = local_1058 - fVar221;
                fStack_1454 = fVar188 - fVar221;
                fStack_1450 = fVar201 - fVar221;
                fStack_144c = pfVar3[1] - fVar221;
                local_1038 = CONCAT44(fVar199,local_1498);
                local_1028 = pfVar4[2];
                fStack_1024 = pfVar3[2];
                local_1498 = local_1498 - fVar224;
                fStack_1494 = fVar199 - fVar224;
                fStack_1490 = pfVar4[2] - fVar224;
                fStack_148c = pfVar3[2] - fVar224;
                local_fb8 = fVar212 - local_f98;
                fStack_fb4 = fVar209 - fStack_f94;
                fStack_fb0 = fVar210 - fStack_f90;
                fStack_fac = fVar211 - fStack_f8c;
                local_fd8 = local_1458 - local_fa8;
                fStack_fd4 = fStack_1454 - fStack_fa4;
                fStack_fd0 = fStack_1450 - fStack_fa0;
                fStack_fcc = fStack_144c - fStack_f9c;
                local_fc8 = local_1498 - (float)local_1258._0_4_;
                fStack_fc4 = fStack_1494 - (float)local_1258._4_4_;
                fStack_fc0 = fStack_1490 - fStack_1250;
                fStack_fbc = fStack_148c - fStack_124c;
                local_14a8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
                local_14a8._0_4_ = local_14a8._4_4_;
                fStack_14a0 = (float)local_14a8._4_4_;
                fStack_149c = (float)local_14a8._4_4_;
                fStack_14ac = *(float *)(ray + k * 4 + 0x60);
                fStack_140c = *(float *)(ray + k * 4 + 0x40);
                fVar253 = (local_fd8 * (local_1498 + (float)local_1258._0_4_) -
                          (local_1458 + local_fa8) * local_fc8) * fStack_140c +
                          ((fVar212 + local_f98) * local_fc8 -
                          (local_1498 + (float)local_1258._0_4_) * local_fb8) *
                          (float)local_14a8._4_4_ +
                          (local_fb8 * (local_1458 + local_fa8) - (fVar212 + local_f98) * local_fd8)
                          * fStack_14ac;
                fVar255 = (fStack_fd4 * (fStack_1494 + (float)local_1258._4_4_) -
                          (fStack_1454 + fStack_fa4) * fStack_fc4) * fStack_140c +
                          ((fVar209 + fStack_f94) * fStack_fc4 -
                          (fStack_1494 + (float)local_1258._4_4_) * fStack_fb4) *
                          (float)local_14a8._4_4_ +
                          (fStack_fb4 * (fStack_1454 + fStack_fa4) -
                          (fVar209 + fStack_f94) * fStack_fd4) * fStack_14ac;
                local_1008._0_8_ = CONCAT44(fVar255,fVar253);
                local_1008._8_4_ =
                     (fStack_fd0 * (fStack_1490 + fStack_1250) -
                     (fStack_1450 + fStack_fa0) * fStack_fc0) * fStack_140c +
                     ((fVar210 + fStack_f90) * fStack_fc0 - (fStack_1490 + fStack_1250) * fStack_fb0
                     ) * (float)local_14a8._4_4_ +
                     (fStack_fb0 * (fStack_1450 + fStack_fa0) - (fVar210 + fStack_f90) * fStack_fd0)
                     * fStack_14ac;
                local_1008._12_4_ =
                     (fStack_fcc * (fStack_148c + fStack_124c) -
                     (fStack_144c + fStack_f9c) * fStack_fbc) * fStack_140c +
                     ((fVar211 + fStack_f8c) * fStack_fbc - (fStack_148c + fStack_124c) * fStack_fac
                     ) * (float)local_14a8._4_4_ +
                     (fStack_fac * (fStack_144c + fStack_f9c) - (fVar211 + fStack_f8c) * fStack_fcc)
                     * fStack_14ac;
                fStack_1044 = pfVar2[1];
                fStack_1040 = fVar198;
                fStack_103c = fVar188;
                fVar168 = local_1048 - fVar221;
                fVar174 = pfVar2[1] - fVar221;
                fVar175 = fVar198 - fVar221;
                fVar176 = fVar188 - fVar221;
                fVar234 = fVar203 - fVar224;
                fVar245 = fVar230 - fVar224;
                fVar248 = fStack_1340 - fVar224;
                fVar202 = fStack_133c - fVar224;
                local_ff8 = local_f98 - fVar219;
                fStack_ff4 = fStack_f94 - fVar222;
                fStack_ff0 = fStack_f90 - fVar225;
                fStack_fec = fStack_f8c - fVar227;
                fVar235 = local_fa8 - fVar168;
                fVar237 = fStack_fa4 - fVar174;
                fVar239 = fStack_fa0 - fVar175;
                fVar241 = fStack_f9c - fVar176;
                local_fe8 = (float)local_1258._0_4_ - fVar234;
                fStack_fe4 = (float)local_1258._4_4_ - fVar245;
                fStack_fe0 = fStack_1250 - fVar248;
                fStack_fdc = fStack_124c - fVar202;
                auVar109._0_4_ =
                     (fVar235 * ((float)local_1258._0_4_ + fVar234) -
                     (local_fa8 + fVar168) * local_fe8) * fStack_140c +
                     ((local_f98 + fVar219) * local_fe8 -
                     ((float)local_1258._0_4_ + fVar234) * local_ff8) * (float)local_14a8._4_4_ +
                     (local_ff8 * (local_fa8 + fVar168) - (local_f98 + fVar219) * fVar235) *
                     fStack_14ac;
                auVar109._4_4_ =
                     (fVar237 * ((float)local_1258._4_4_ + fVar245) -
                     (fStack_fa4 + fVar174) * fStack_fe4) * fStack_140c +
                     ((fStack_f94 + fVar222) * fStack_fe4 -
                     ((float)local_1258._4_4_ + fVar245) * fStack_ff4) * (float)local_14a8._4_4_ +
                     (fStack_ff4 * (fStack_fa4 + fVar174) - (fStack_f94 + fVar222) * fVar237) *
                     fStack_14ac;
                auVar109._8_4_ =
                     (fVar239 * (fStack_1250 + fVar248) - (fStack_fa0 + fVar175) * fStack_fe0) *
                     fStack_140c +
                     ((fStack_f90 + fVar225) * fStack_fe0 - (fStack_1250 + fVar248) * fStack_ff0) *
                     (float)local_14a8._4_4_ +
                     (fStack_ff0 * (fStack_fa0 + fVar175) - (fStack_f90 + fVar225) * fVar239) *
                     fStack_14ac;
                auVar109._12_4_ =
                     (fVar241 * (fStack_124c + fVar202) - (fStack_f9c + fVar176) * fStack_fdc) *
                     fStack_140c +
                     ((fStack_f8c + fVar227) * fStack_fdc - (fStack_124c + fVar202) * fStack_fec) *
                     (float)local_14a8._4_4_ +
                     (fStack_fec * (fStack_f9c + fVar176) - (fStack_f8c + fVar227) * fVar241) *
                     fStack_14ac;
                fVar220 = fVar219 - fVar212;
                fVar223 = fVar222 - fVar209;
                fVar226 = fVar225 - fVar210;
                fVar228 = fVar227 - fVar211;
                fVar178 = fVar168 - local_1458;
                fVar185 = fVar174 - fStack_1454;
                fVar186 = fVar175 - fStack_1450;
                fVar187 = fVar176 - fStack_144c;
                fVar213 = fVar234 - local_1498;
                fVar217 = fVar245 - fStack_1494;
                fVar251 = fVar248 - fStack_1490;
                fVar218 = fVar202 - fStack_148c;
                local_1368 = fVar168 + local_1458;
                fStack_1364 = fVar174 + fStack_1454;
                fStack_1360 = fVar175 + fStack_1450;
                fStack_135c = fVar176 + fStack_144c;
                local_1358 = fVar234 + local_1498;
                fStack_1354 = fVar245 + fStack_1494;
                fStack_1350 = fVar248 + fStack_1490;
                fStack_134c = fVar202 + fStack_148c;
                auVar82._0_4_ =
                     (fVar178 * local_1358 - local_1368 * fVar213) * fStack_140c +
                     ((fVar212 + fVar219) * fVar213 - fVar220 * local_1358) *
                     (float)local_14a8._4_4_ +
                     (fVar220 * local_1368 - (fVar212 + fVar219) * fVar178) * fStack_14ac;
                auVar82._4_4_ =
                     (fVar185 * fStack_1354 - fStack_1364 * fVar217) * fStack_140c +
                     ((fVar209 + fVar222) * fVar217 - fVar223 * fStack_1354) *
                     (float)local_14a8._4_4_ +
                     (fVar223 * fStack_1364 - (fVar209 + fVar222) * fVar185) * fStack_14ac;
                auVar82._8_4_ =
                     (fVar186 * fStack_1350 - fStack_1360 * fVar251) * fStack_140c +
                     ((fVar210 + fVar225) * fVar251 - fVar226 * fStack_1350) *
                     (float)local_14a8._4_4_ +
                     (fVar226 * fStack_1360 - (fVar210 + fVar225) * fVar186) * fStack_14ac;
                auVar82._12_4_ =
                     (fVar187 * fStack_134c - fStack_135c * fVar218) * fStack_140c +
                     ((fVar211 + fVar227) * fVar218 - fVar228 * fStack_134c) *
                     (float)local_14a8._4_4_ +
                     (fVar228 * fStack_135c - (fVar211 + fVar227) * fVar187) * fStack_14ac;
                local_1018 = fVar253 + auVar109._0_4_ + auVar82._0_4_;
                fStack_1014 = fVar255 + auVar109._4_4_ + auVar82._4_4_;
                fStack_1010 = local_1008._8_4_ + auVar109._8_4_ + auVar82._8_4_;
                fStack_100c = local_1008._12_4_ + auVar109._12_4_ + auVar82._12_4_;
                auVar190._8_4_ = local_1008._8_4_;
                auVar190._0_8_ = local_1008._0_8_;
                auVar190._12_4_ = local_1008._12_4_;
                auVar191 = minps(auVar190,auVar109);
                auVar191 = minps(auVar191,auVar82);
                auVar204._8_4_ = local_1008._8_4_;
                auVar204._0_8_ = local_1008._0_8_;
                auVar204._12_4_ = local_1008._12_4_;
                auVar205 = maxps(auVar204,auVar109);
                auVar205 = maxps(auVar205,auVar82);
                uVar149 = (uint)DAT_01f7b6c0;
                uVar165 = DAT_01f7b6c0._4_4_;
                uVar166 = DAT_01f7b6c0._8_4_;
                uVar167 = DAT_01f7b6c0._12_4_;
                fVar212 = (float)((uint)local_1018 & uVar149);
                fVar211 = (float)((uint)fStack_1014 & uVar165);
                fVar209 = (float)((uint)fStack_1010 & uVar166);
                fVar210 = (float)((uint)fStack_100c & uVar167);
                auVar206._4_4_ = -(uint)(auVar205._4_4_ <= fVar211 * 1.1920929e-07);
                auVar206._0_4_ = -(uint)(auVar205._0_4_ <= fVar212 * 1.1920929e-07);
                auVar206._8_4_ = -(uint)(auVar205._8_4_ <= fVar209 * 1.1920929e-07);
                auVar206._12_4_ = -(uint)(auVar205._12_4_ <= fVar210 * 1.1920929e-07);
                auVar192._4_4_ = -(uint)(-(fVar211 * 1.1920929e-07) <= auVar191._4_4_);
                auVar192._0_4_ = -(uint)(-(fVar212 * 1.1920929e-07) <= auVar191._0_4_);
                auVar192._8_4_ = -(uint)(-(fVar209 * 1.1920929e-07) <= auVar191._8_4_);
                auVar192._12_4_ = -(uint)(-(fVar210 * 1.1920929e-07) <= auVar191._12_4_);
                auVar206 = auVar206 | auVar192;
                iVar37 = movmskps((int)lVar13,auVar206);
                sx.field_0.i[0] = (int)fVar229;
                sx.field_0.i[1] = (int)fVar229;
                sx.field_0.i[2] = (int)fVar229;
                sx.field_0.i[3] = (int)fVar229;
                local_1158 = ZEXT416(uVar39);
                local_1168 = ZEXT416(uVar9);
                if (iVar37 == 0) {
LAB_00214b79:
                  uVar39 = (uint)pSVar34;
                }
                else {
                  local_1028 = fVar212;
                  fStack_1024 = fVar211;
                  fStack_1020 = fVar209;
                  fStack_101c = fVar210;
                  uVar48 = -(uint)((float)((uint)(fVar178 * local_fe8) & uVar149) <=
                                  (float)((uint)(fVar235 * local_fc8) & uVar149));
                  uVar50 = -(uint)((float)((uint)(fVar185 * fStack_fe4) & uVar165) <=
                                  (float)((uint)(fVar237 * fStack_fc4) & uVar165));
                  uVar54 = -(uint)((float)((uint)(fVar186 * fStack_fe0) & uVar166) <=
                                  (float)((uint)(fVar239 * fStack_fc0) & uVar166));
                  uVar58 = -(uint)((float)((uint)(fVar187 * fStack_fdc) & uVar167) <=
                                  (float)((uint)(fVar241 * fStack_fbc) & uVar167));
                  uVar49 = -(uint)((float)((uint)(local_ff8 * fVar213) & uVar149) <=
                                  (float)((uint)(local_fb8 * local_fe8) & uVar149));
                  uVar51 = -(uint)((float)((uint)(fStack_ff4 * fVar217) & uVar165) <=
                                  (float)((uint)(fStack_fb4 * fStack_fe4) & uVar165));
                  uVar55 = -(uint)((float)((uint)(fStack_ff0 * fVar251) & uVar166) <=
                                  (float)((uint)(fStack_fb0 * fStack_fe0) & uVar166));
                  uVar59 = -(uint)((float)((uint)(fStack_fec * fVar218) & uVar167) <=
                                  (float)((uint)(fStack_fac * fStack_fdc) & uVar167));
                  uVar149 = -(uint)((float)((uint)(fVar220 * fVar235) & uVar149) <=
                                   (float)((uint)(local_ff8 * local_fd8) & uVar149));
                  uVar52 = -(uint)((float)((uint)(fVar223 * fVar237) & uVar165) <=
                                  (float)((uint)(fStack_ff4 * fStack_fd4) & uVar165));
                  uVar56 = -(uint)((float)((uint)(fVar226 * fVar239) & uVar166) <=
                                  (float)((uint)(fStack_ff0 * fStack_fd0) & uVar166));
                  uVar60 = -(uint)((float)((uint)(fVar228 * fVar241) & uVar167) <=
                                  (float)((uint)(fStack_fec * fStack_fcc) & uVar167));
                  local_12a8._0_4_ =
                       ~uVar48 & (uint)(local_fd8 * local_fe8 - fVar235 * local_fc8) |
                       (uint)(fVar235 * fVar213 - fVar178 * local_fe8) & uVar48;
                  local_12a8._4_4_ =
                       ~uVar50 & (uint)(fStack_fd4 * fStack_fe4 - fVar237 * fStack_fc4) |
                       (uint)(fVar237 * fVar217 - fVar185 * fStack_fe4) & uVar50;
                  fStack_12a0 = (float)(~uVar54 & (uint)(fStack_fd0 * fStack_fe0 -
                                                        fVar239 * fStack_fc0) |
                                       (uint)(fVar239 * fVar251 - fVar186 * fStack_fe0) & uVar54);
                  fStack_129c = (float)(~uVar58 & (uint)(fStack_fcc * fStack_fdc -
                                                        fVar241 * fStack_fbc) |
                                       (uint)(fVar241 * fVar218 - fVar187 * fStack_fdc) & uVar58);
                  local_1298[0] =
                       (float)(~uVar49 & (uint)(local_fc8 * local_ff8 - local_fb8 * local_fe8) |
                              (uint)(fVar220 * local_fe8 - local_ff8 * fVar213) & uVar49);
                  local_1298[1] =
                       (float)(~uVar51 & (uint)(fStack_fc4 * fStack_ff4 - fStack_fb4 * fStack_fe4) |
                              (uint)(fVar223 * fStack_fe4 - fStack_ff4 * fVar217) & uVar51);
                  local_1298[2] =
                       (float)(~uVar55 & (uint)(fStack_fc0 * fStack_ff0 - fStack_fb0 * fStack_fe0) |
                              (uint)(fVar226 * fStack_fe0 - fStack_ff0 * fVar251) & uVar55);
                  local_1298[3] =
                       (float)(~uVar59 & (uint)(fStack_fbc * fStack_fec - fStack_fac * fStack_fdc) |
                              (uint)(fVar228 * fStack_fdc - fStack_fec * fVar218) & uVar59);
                  local_1288[0] =
                       (float)(~uVar149 & (uint)(local_fb8 * fVar235 - local_ff8 * local_fd8) |
                              (uint)(local_ff8 * fVar178 - fVar220 * fVar235) & uVar149);
                  local_1288[1] =
                       (float)(~uVar52 & (uint)(fStack_fb4 * fVar237 - fStack_ff4 * fStack_fd4) |
                              (uint)(fStack_ff4 * fVar185 - fVar223 * fVar237) & uVar52);
                  local_1288[2] =
                       (float)(~uVar56 & (uint)(fStack_fb0 * fVar239 - fStack_ff0 * fStack_fd0) |
                              (uint)(fStack_ff0 * fVar186 - fVar226 * fVar239) & uVar56);
                  local_1288[3] =
                       (float)(~uVar60 & (uint)(fStack_fac * fVar241 - fStack_fec * fStack_fcc) |
                              (uint)(fStack_fec * fVar187 - fVar228 * fVar241) & uVar60);
                  fVar178 = fStack_140c * (float)local_12a8._0_4_ +
                            (float)local_14a8._4_4_ * local_1298[0] + fStack_14ac * local_1288[0];
                  fVar185 = fStack_140c * (float)local_12a8._4_4_ +
                            (float)local_14a8._4_4_ * local_1298[1] + fStack_14ac * local_1288[1];
                  fVar186 = fStack_140c * fStack_12a0 +
                            (float)local_14a8._4_4_ * local_1298[2] + fStack_14ac * local_1288[2];
                  fVar187 = fStack_140c * fStack_129c +
                            (float)local_14a8._4_4_ * local_1298[3] + fStack_14ac * local_1288[3];
                  auVar132._0_4_ = fVar178 + fVar178;
                  auVar132._4_4_ = fVar185 + fVar185;
                  auVar132._8_4_ = fVar186 + fVar186;
                  auVar132._12_4_ = fVar187 + fVar187;
                  auVar83._0_4_ = (float)local_1258._0_4_ * local_1288[0];
                  auVar83._4_4_ = (float)local_1258._4_4_ * local_1288[1];
                  auVar83._8_4_ = fStack_1250 * local_1288[2];
                  auVar83._12_4_ = fStack_124c * local_1288[3];
                  fVar185 = local_f98 * (float)local_12a8._0_4_ +
                            local_fa8 * local_1298[0] + auVar83._0_4_;
                  fVar217 = fStack_f94 * (float)local_12a8._4_4_ +
                            fStack_fa4 * local_1298[1] + auVar83._4_4_;
                  fVar251 = fStack_f90 * fStack_12a0 + fStack_fa0 * local_1298[2] + auVar83._8_4_;
                  fVar218 = fStack_f8c * fStack_129c + fStack_f9c * local_1298[3] + auVar83._12_4_;
                  auVar191 = rcpps(auVar83,auVar132);
                  fVar178 = auVar191._0_4_;
                  fVar186 = auVar191._4_4_;
                  fVar187 = auVar191._8_4_;
                  fVar213 = auVar191._12_4_;
                  fVar185 = ((1.0 - auVar132._0_4_ * fVar178) * fVar178 + fVar178) *
                            (fVar185 + fVar185);
                  fVar186 = ((1.0 - auVar132._4_4_ * fVar186) * fVar186 + fVar186) *
                            (fVar217 + fVar217);
                  fVar187 = ((1.0 - auVar132._8_4_ * fVar187) * fVar187 + fVar187) *
                            (fVar251 + fVar251);
                  fVar213 = ((1.0 - auVar132._12_4_ * fVar213) * fVar213 + fVar213) *
                            (fVar218 + fVar218);
                  fVar178 = *(float *)(ray + k * 4 + 0x30);
                  iVar53 = -(uint)(fVar178 <= fVar186);
                  iVar57 = -(uint)(fVar178 <= fVar187);
                  iVar61 = -(uint)(fVar178 <= fVar213);
                  auVar156._8_4_ = iVar57;
                  auVar156._4_4_ = iVar53;
                  auVar156._12_4_ = iVar61;
                  auVar84._0_4_ = -(uint)(fVar185 <= fVar126 && fVar178 <= fVar185) & auVar206._0_4_
                  ;
                  auVar84._4_4_ = -(uint)(fVar186 <= fVar126 && fVar178 <= fVar186) & auVar206._4_4_
                  ;
                  auVar84._8_4_ = -(uint)(fVar187 <= fVar126 && fVar178 <= fVar187) & auVar206._8_4_
                  ;
                  auVar84._12_4_ =
                       -(uint)(fVar213 <= fVar126 && fVar178 <= fVar213) & auVar206._12_4_;
                  iVar37 = movmskps(iVar37,auVar84);
                  if (iVar37 == 0) goto LAB_00214b79;
                  valid.field_0.i[0] = auVar84._0_4_ & -(uint)(auVar132._0_4_ != 0.0);
                  valid.field_0.i[1] = auVar84._4_4_ & -(uint)(auVar132._4_4_ != 0.0);
                  valid.field_0.i[2] = auVar84._8_4_ & -(uint)(auVar132._8_4_ != 0.0);
                  valid.field_0.i[3] = auVar84._12_4_ & -(uint)(auVar132._12_4_ != 0.0);
                  iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
                  if (iVar37 == 0) goto LAB_00214b79;
                  auVar24._4_4_ = fStack_1014;
                  auVar24._0_4_ = local_1018;
                  auVar24._8_4_ = fStack_1010;
                  auVar24._12_4_ = fStack_100c;
                  local_12b8._4_4_ = fVar186;
                  local_12b8._0_4_ = fVar185;
                  fStack_12b0 = fVar187;
                  fStack_12ac = fVar213;
                  auVar156._0_4_ = (float)(int)(*(ushort *)(lVar12 + 8 + lVar41) - 1);
                  auVar207._4_4_ = iVar53;
                  auVar207._0_4_ = auVar156._0_4_;
                  auVar207._8_4_ = iVar57;
                  auVar207._12_4_ = iVar61;
                  auVar191 = rcpss(auVar207,auVar156);
                  auVar214._0_4_ = (float)(int)(*(ushort *)(lVar12 + 10 + lVar41) - 1);
                  auVar214._4_12_ = DAT_01f7b6c0._4_12_;
                  fVar126 = (2.0 - auVar156._0_4_ * auVar191._0_4_) * auVar191._0_4_;
                  auVar208._4_4_ = uVar165;
                  auVar208._0_4_ = auVar214._0_4_;
                  auVar208._8_4_ = uVar166;
                  auVar208._12_4_ = uVar167;
                  auVar191 = rcpss(auVar208,auVar214);
                  fVar178 = (2.0 - auVar214._0_4_ * auVar191._0_4_) * auVar191._0_4_;
                  tNear.field_0.v[0] = fVar126 * (fVar253 + (float)(int)fVar229 * local_1018);
                  tNear.field_0.v[1] = fVar126 * (fVar255 + (float)((int)fVar229 + 1) * fStack_1014)
                  ;
                  tNear.field_0.v[2] =
                       fVar126 * (local_1008._8_4_ + (float)((int)fVar229 + 1) * fStack_1010);
                  tNear.field_0.v[3] =
                       fVar126 * (local_1008._12_4_ + (float)(int)fVar229 * fStack_100c);
                  auVar171._0_4_ = (float)(int)fVar199 * local_1018 + auVar109._0_4_;
                  auVar171._4_4_ = (float)(int)fVar199 * fStack_1014 + auVar109._4_4_;
                  auVar171._8_4_ = (float)((int)fVar199 + 1) * fStack_1010 + auVar109._8_4_;
                  auVar171._12_4_ = (float)((int)fVar199 + 1) * fStack_100c + auVar109._12_4_;
                  pGVar11 = (pSVar34->geometries).items[local_1428._0_8_].ptr;
                  uVar149 = *(uint *)(ray + k * 4 + 0x90);
                  pSVar34 = (Scene *)(ulong)uVar149;
                  if ((pGVar11->mask & uVar149) == 0) goto LAB_00214b79;
                  local_1428._8_8_ = 0;
                  auVar191 = rcpps(auVar171,auVar24);
                  fVar126 = auVar191._0_4_;
                  fVar217 = auVar191._4_4_;
                  fVar251 = auVar191._8_4_;
                  fVar218 = auVar191._12_4_;
                  fVar126 = (float)(-(uint)(1e-18 <= fVar212) &
                                   (uint)(((float)DAT_01f7ba10 - local_1018 * fVar126) * fVar126 +
                                         fVar126));
                  fVar212 = (float)(-(uint)(1e-18 <= fVar211) &
                                   (uint)((DAT_01f7ba10._4_4_ - fStack_1014 * fVar217) * fVar217 +
                                         fVar217));
                  fVar211 = (float)(-(uint)(1e-18 <= fVar209) &
                                   (uint)((DAT_01f7ba10._8_4_ - fStack_1010 * fVar251) * fVar251 +
                                         fVar251));
                  fVar209 = (float)(-(uint)(1e-18 <= fVar210) &
                                   (uint)((DAT_01f7ba10._12_4_ - fStack_100c * fVar218) * fVar218 +
                                         fVar218));
                  auVar133._0_4_ = tNear.field_0.v[0] * fVar126;
                  auVar133._4_4_ = tNear.field_0.v[1] * fVar212;
                  auVar133._8_4_ = tNear.field_0.v[2] * fVar211;
                  auVar133._12_4_ = tNear.field_0.v[3] * fVar209;
                  local_12d8 = minps(auVar133,_DAT_01f7ba10);
                  auVar157._0_4_ = fVar178 * auVar171._0_4_ * fVar126;
                  auVar157._4_4_ = fVar178 * auVar171._4_4_ * fVar212;
                  auVar157._8_4_ = fVar178 * auVar171._8_4_ * fVar211;
                  auVar157._12_4_ = fVar178 * auVar171._12_4_ * fVar209;
                  local_12c8 = minps(auVar157,_DAT_01f7ba10);
                  auVar110._0_4_ = (uint)fVar185 & valid.field_0.i[0];
                  auVar110._4_4_ = (uint)fVar186 & valid.field_0.i[1];
                  auVar110._8_4_ = (uint)fVar187 & valid.field_0.i[2];
                  auVar110._12_4_ = (uint)fVar213 & valid.field_0.i[3];
                  auVar134._0_8_ =
                       CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                  auVar134._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                  auVar134._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                  auVar134 = auVar134 | auVar110;
                  auVar158._4_4_ = auVar134._0_4_;
                  auVar158._0_4_ = auVar134._4_4_;
                  auVar158._8_4_ = auVar134._12_4_;
                  auVar158._12_4_ = auVar134._8_4_;
                  auVar191 = minps(auVar158,auVar134);
                  auVar111._0_8_ = auVar191._8_8_;
                  auVar111._8_4_ = auVar191._0_4_;
                  auVar111._12_4_ = auVar191._4_4_;
                  auVar191 = minps(auVar111,auVar191);
                  uVar48 = -(uint)(auVar191._0_4_ == auVar134._0_4_);
                  uVar49 = -(uint)(auVar191._4_4_ == auVar134._4_4_);
                  uVar50 = -(uint)(auVar191._8_4_ == auVar134._8_4_);
                  uVar51 = -(uint)(auVar191._12_4_ == auVar134._12_4_);
                  auVar135._0_4_ = uVar48 & valid.field_0.i[0];
                  auVar135._4_4_ = uVar49 & valid.field_0.i[1];
                  auVar135._8_4_ = uVar50 & valid.field_0.i[2];
                  auVar135._12_4_ = uVar51 & valid.field_0.i[3];
                  iVar37 = movmskps(uVar149,auVar135);
                  uVar149 = 0xffffffff;
                  uVar165 = 0xffffffff;
                  uVar166 = 0xffffffff;
                  uVar167 = 0xffffffff;
                  if (iVar37 != 0) {
                    uVar149 = uVar48;
                    uVar165 = uVar49;
                    uVar166 = uVar50;
                    uVar167 = uVar51;
                  }
                  auVar85._0_4_ = valid.field_0.i[0] & uVar149;
                  auVar85._4_4_ = valid.field_0.i[1] & uVar165;
                  auVar85._8_4_ = valid.field_0.i[2] & uVar166;
                  auVar85._12_4_ = valid.field_0.i[3] & uVar167;
                  uVar149 = movmskps(iVar37,auVar85);
                  lVar33 = 0;
                  if (uVar149 != 0) {
                    for (; (uVar149 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar30 = *(undefined4 *)(local_12d8 + lVar33 * 4);
                    uVar7 = *(undefined4 *)(local_12c8 + lVar33 * 4);
                    fVar126 = local_1298[lVar33 + -4];
                    fVar203 = local_1298[lVar33];
                    fVar212 = local_1288[lVar33];
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12b8 + lVar33 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = fVar126;
                    *(float *)(ray + k * 4 + 0xd0) = fVar203;
                    *(float *)(ray + k * 4 + 0xe0) = fVar212;
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
                    *(uint *)(ray + k * 4 + 0x110) = uVar9;
                    *(uint *)(ray + k * 4 + 0x120) = uVar39;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar39 = context->user->instPrimID[0];
                    *(uint *)(ray + k * 4 + 0x140) = uVar39;
                  }
                  else {
                    auVar26 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar32);
                    fStack_148c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar32 + 8) >>
                                         0x20);
                    _local_14a8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    local_1418 = fVar185;
                    fStack_1414 = fVar186;
                    fStack_1410 = fVar187;
                    fStack_140c = fVar213;
                    while( true ) {
                      local_1108 = *(undefined4 *)(local_12d8 + lVar33 * 4);
                      local_10f8._4_4_ = *(undefined4 *)(local_12c8 + lVar33 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12b8 + lVar33 * 4)
                      ;
                      args.context = context->user;
                      local_1138 = local_1298[lVar33 + -4];
                      local_1128._4_4_ = local_1298[lVar33];
                      local_1118._4_4_ = local_1288[lVar33];
                      fStack_1134 = local_1138;
                      fStack_1130 = local_1138;
                      fStack_112c = local_1138;
                      local_1128._0_4_ = local_1128._4_4_;
                      fStack_1120 = (float)local_1128._4_4_;
                      fStack_111c = (float)local_1128._4_4_;
                      local_1118._0_4_ = local_1118._4_4_;
                      fStack_1110 = (float)local_1118._4_4_;
                      fStack_110c = (float)local_1118._4_4_;
                      uStack_1104 = local_1108;
                      uStack_1100 = local_1108;
                      uStack_10fc = local_1108;
                      local_10f8._0_4_ = local_10f8._4_4_;
                      local_10f8._8_4_ = local_10f8._4_4_;
                      local_10f8._12_4_ = local_10f8._4_4_;
                      local_10e8 = CONCAT44(uVar9,uVar9);
                      uStack_10e0 = CONCAT44(uVar9,uVar9);
                      local_10d8 = CONCAT44(uVar39,uVar39);
                      uStack_10d0 = CONCAT44(uVar39,uVar39);
                      local_10c8 = (args.context)->instID[0];
                      uStack_10c4 = local_10c8;
                      uStack_10c0 = local_10c8;
                      uStack_10bc = local_10c8;
                      local_10b8 = (args.context)->instPrimID[0];
                      uStack_10b4 = local_10b8;
                      uStack_10b0 = local_10b8;
                      uStack_10ac = local_10b8;
                      local_1438._12_4_ = fStack_148c;
                      local_1438._0_12_ = auVar26;
                      args.valid = (int *)local_1438;
                      args.geometryUserPtr = pGVar11->userPtr;
                      args.hit = (RTCHitN *)&local_1138;
                      args.N = 4;
                      p_Var36 = pGVar11->intersectionFilterN;
                      args.ray = (RTCRayN *)ray;
                      if (p_Var36 != (RTCFilterFunctionN)0x0) {
                        p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                        fVar185 = local_1418;
                        fVar186 = fStack_1414;
                        fVar187 = fStack_1410;
                        fVar213 = fStack_140c;
                      }
                      auVar112._0_4_ = -(uint)(local_1438._0_4_ == 0);
                      auVar112._4_4_ = -(uint)(local_1438._4_4_ == 0);
                      auVar112._8_4_ = -(uint)(local_1438._8_4_ == 0);
                      auVar112._12_4_ = -(uint)(local_1438._12_4_ == 0);
                      uVar149 = movmskps((int)p_Var36,auVar112);
                      pRVar35 = (RTCRayN *)(ulong)(uVar149 ^ 0xf);
                      if ((uVar149 ^ 0xf) == 0) {
                        auVar112 = auVar112 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var36 = context->args->filter;
                        if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                          fVar185 = local_1418;
                          fVar186 = fStack_1414;
                          fVar187 = fStack_1410;
                          fVar213 = fStack_140c;
                        }
                        auVar86._0_4_ = -(uint)(local_1438._0_4_ == 0);
                        auVar86._4_4_ = -(uint)(local_1438._4_4_ == 0);
                        auVar86._8_4_ = -(uint)(local_1438._8_4_ == 0);
                        auVar86._12_4_ = -(uint)(local_1438._12_4_ == 0);
                        auVar112 = auVar86 ^ _DAT_01f7ae20;
                        uVar149 = movmskps((int)p_Var36,auVar86);
                        pRVar35 = (RTCRayN *)(ulong)(uVar149 ^ 0xf);
                        if ((uVar149 ^ 0xf) != 0) {
                          auVar136._0_4_ = *(uint *)(args.ray + 0xc0) & auVar86._0_4_;
                          auVar136._4_4_ = *(uint *)(args.ray + 0xc4) & auVar86._4_4_;
                          auVar136._8_4_ = *(uint *)(args.ray + 200) & auVar86._8_4_;
                          auVar136._12_4_ = *(uint *)(args.ray + 0xcc) & auVar86._12_4_;
                          auVar193._0_4_ = ~auVar86._0_4_ & *(uint *)args.hit;
                          auVar193._4_4_ = ~auVar86._4_4_ & *(uint *)(args.hit + 4);
                          auVar193._8_4_ = ~auVar86._8_4_ & *(uint *)(args.hit + 8);
                          auVar193._12_4_ = ~auVar86._12_4_ & *(uint *)(args.hit + 0xc);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar193 | auVar136;
                          uVar149 = *(uint *)(args.hit + 0x14);
                          uVar165 = *(uint *)(args.hit + 0x18);
                          uVar166 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar86._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar86._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar86._4_4_ & uVar149 | *(uint *)(args.ray + 0xd4) & auVar86._4_4_
                          ;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar86._8_4_ & uVar165 | *(uint *)(args.ray + 0xd8) & auVar86._8_4_
                          ;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar86._12_4_ & uVar166 |
                               *(uint *)(args.ray + 0xdc) & auVar86._12_4_;
                          uVar149 = *(uint *)(args.hit + 0x24);
                          uVar165 = *(uint *)(args.hit + 0x28);
                          uVar166 = *(uint *)(args.hit + 0x2c);
                          *(uint *)(args.ray + 0xe0) =
                               ~auVar86._0_4_ & *(uint *)(args.hit + 0x20) |
                               *(uint *)(args.ray + 0xe0) & auVar86._0_4_;
                          *(uint *)(args.ray + 0xe4) =
                               ~auVar86._4_4_ & uVar149 | *(uint *)(args.ray + 0xe4) & auVar86._4_4_
                          ;
                          *(uint *)(args.ray + 0xe8) =
                               ~auVar86._8_4_ & uVar165 | *(uint *)(args.ray + 0xe8) & auVar86._8_4_
                          ;
                          *(uint *)(args.ray + 0xec) =
                               ~auVar86._12_4_ & uVar166 |
                               *(uint *)(args.ray + 0xec) & auVar86._12_4_;
                          uVar149 = *(uint *)(args.hit + 0x34);
                          uVar165 = *(uint *)(args.hit + 0x38);
                          uVar166 = *(uint *)(args.hit + 0x3c);
                          *(uint *)(args.ray + 0xf0) =
                               ~auVar86._0_4_ & *(uint *)(args.hit + 0x30) |
                               *(uint *)(args.ray + 0xf0) & auVar86._0_4_;
                          *(uint *)(args.ray + 0xf4) =
                               ~auVar86._4_4_ & uVar149 | *(uint *)(args.ray + 0xf4) & auVar86._4_4_
                          ;
                          *(uint *)(args.ray + 0xf8) =
                               ~auVar86._8_4_ & uVar165 | *(uint *)(args.ray + 0xf8) & auVar86._8_4_
                          ;
                          *(uint *)(args.ray + 0xfc) =
                               ~auVar86._12_4_ & uVar166 |
                               *(uint *)(args.ray + 0xfc) & auVar86._12_4_;
                          uVar149 = *(uint *)(args.hit + 0x44);
                          uVar165 = *(uint *)(args.hit + 0x48);
                          uVar166 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar86._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar86._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar86._4_4_ & uVar149 |
                               *(uint *)(args.ray + 0x104) & auVar86._4_4_;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar86._8_4_ & uVar165 |
                               *(uint *)(args.ray + 0x108) & auVar86._8_4_;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar86._12_4_ & uVar166 |
                               *(uint *)(args.ray + 0x10c) & auVar86._12_4_;
                          uVar149 = *(uint *)(args.hit + 0x54);
                          uVar165 = *(uint *)(args.hit + 0x58);
                          uVar166 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar86._0_4_ |
                               ~auVar86._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar86._4_4_ |
                               ~auVar86._4_4_ & uVar149;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar86._8_4_ |
                               ~auVar86._8_4_ & uVar165;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar86._12_4_ |
                               ~auVar86._12_4_ & uVar166;
                          uVar149 = *(uint *)(args.hit + 100);
                          uVar165 = *(uint *)(args.hit + 0x68);
                          uVar166 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar86._0_4_ |
                               ~auVar86._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar86._4_4_ |
                               ~auVar86._4_4_ & uVar149;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar86._8_4_ |
                               ~auVar86._8_4_ & uVar165;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar86._12_4_ |
                               ~auVar86._12_4_ & uVar166;
                          uVar149 = *(uint *)(args.hit + 0x74);
                          uVar165 = *(uint *)(args.hit + 0x78);
                          uVar166 = *(uint *)(args.hit + 0x7c);
                          *(uint *)(args.ray + 0x130) =
                               ~auVar86._0_4_ & *(uint *)(args.hit + 0x70) |
                               *(uint *)(args.ray + 0x130) & auVar86._0_4_;
                          *(uint *)(args.ray + 0x134) =
                               ~auVar86._4_4_ & uVar149 |
                               *(uint *)(args.ray + 0x134) & auVar86._4_4_;
                          *(uint *)(args.ray + 0x138) =
                               ~auVar86._8_4_ & uVar165 |
                               *(uint *)(args.ray + 0x138) & auVar86._8_4_;
                          *(uint *)(args.ray + 0x13c) =
                               ~auVar86._12_4_ & uVar166 |
                               *(uint *)(args.ray + 0x13c) & auVar86._12_4_;
                          *(undefined1 (*) [16])(args.ray + 0x140) =
                               ~auVar86 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar86;
                          pRVar35 = args.ray;
                        }
                      }
                      auVar113._0_4_ = auVar112._0_4_ << 0x1f;
                      auVar113._4_4_ = auVar112._4_4_ << 0x1f;
                      auVar113._8_4_ = auVar112._8_4_ << 0x1f;
                      auVar113._12_4_ = auVar112._12_4_ << 0x1f;
                      iVar37 = movmskps((int)pRVar35,auVar113);
                      if (iVar37 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_14a8._0_4_;
                      }
                      else {
                        local_14a8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_14a8._4_4_ = 0;
                        fStack_14a0 = 0.0;
                        fStack_149c = 0.0;
                      }
                      *(undefined4 *)(local_1438 + lVar33 * 4 + -0x10) = 0;
                      valid.field_0.i[0] =
                           -(uint)(fVar185 <= (float)local_14a8._0_4_) & valid.field_0.i[0];
                      valid.field_0.i[1] =
                           -(uint)(fVar186 <= (float)local_14a8._0_4_) & valid.field_0.i[1];
                      valid.field_0.i[2] =
                           -(uint)(fVar187 <= (float)local_14a8._0_4_) & valid.field_0.i[2];
                      valid.field_0.i[3] =
                           -(uint)(fVar213 <= (float)local_14a8._0_4_) & valid.field_0.i[3];
                      iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
                      if (iVar37 == 0) break;
                      auVar114._0_4_ = valid.field_0.i[0] & (uint)fVar185;
                      auVar114._4_4_ = valid.field_0.i[1] & (uint)fVar186;
                      auVar114._8_4_ = valid.field_0.i[2] & (uint)fVar187;
                      auVar114._12_4_ = valid.field_0.i[3] & (uint)fVar213;
                      auVar137._0_8_ =
                           CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                      auVar137._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                      auVar137._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                      auVar137 = auVar137 | auVar114;
                      auVar159._4_4_ = auVar137._0_4_;
                      auVar159._0_4_ = auVar137._4_4_;
                      auVar159._8_4_ = auVar137._12_4_;
                      auVar159._12_4_ = auVar137._8_4_;
                      auVar191 = minps(auVar159,auVar137);
                      auVar115._0_8_ = auVar191._8_8_;
                      auVar115._8_4_ = auVar191._0_4_;
                      auVar115._12_4_ = auVar191._4_4_;
                      auVar191 = minps(auVar115,auVar191);
                      auVar116._0_8_ =
                           CONCAT44(-(uint)(auVar191._4_4_ == auVar137._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar191._0_4_ == auVar137._0_4_) & valid.field_0.i[0]);
                      auVar116._8_4_ =
                           -(uint)(auVar191._8_4_ == auVar137._8_4_) & valid.field_0.i[2];
                      auVar116._12_4_ =
                           -(uint)(auVar191._12_4_ == auVar137._12_4_) & valid.field_0.i[3];
                      iVar37 = movmskps(iVar37,auVar116);
                      aVar87 = valid.field_0;
                      if (iVar37 != 0) {
                        aVar87.i[2] = auVar116._8_4_;
                        aVar87._0_8_ = auVar116._0_8_;
                        aVar87.i[3] = auVar116._12_4_;
                      }
                      uVar30 = movmskps(iVar37,(undefined1  [16])aVar87);
                      uVar40 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar30);
                      lVar33 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                        }
                      }
                    }
                    fVar221 = *(float *)(ray + k * 4 + 0x10);
                    fVar224 = *(float *)(ray + k * 4 + 0x20);
                    fStack_140c = *(float *)(ray + k * 4 + 0x40);
                    local_14a8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
                    fStack_14ac = *(float *)(ray + k * 4 + 0x60);
                    local_1458 = local_1058 - fVar221;
                    fStack_1454 = fStack_1054 - fVar221;
                    fStack_1450 = fStack_1050 - fVar221;
                    fStack_144c = fStack_104c - fVar221;
                    local_1498 = (float)local_1038 - fVar224;
                    fStack_1494 = local_1038._4_4_ - fVar224;
                    fStack_1490 = fStack_1030 - fVar224;
                    fStack_148c = fStack_102c - fVar224;
                    fVar168 = local_1048 - fVar221;
                    fVar174 = fStack_1044 - fVar221;
                    fVar175 = fStack_1040 - fVar221;
                    fVar176 = fStack_103c - fVar221;
                    fVar234 = fVar203 - fVar224;
                    fVar245 = fVar230 - fVar224;
                    fVar248 = fStack_1340 - fVar224;
                    fVar202 = fStack_133c - fVar224;
                    local_1368 = local_1458 + fVar168;
                    fStack_1364 = fStack_1454 + fVar174;
                    fStack_1360 = fStack_1450 + fVar175;
                    fStack_135c = fStack_144c + fVar176;
                    fStack_1354 = fStack_1494 + fVar245;
                    local_1358 = local_1498 + fVar234;
                    fStack_1350 = fStack_1490 + fVar248;
                    fStack_134c = fStack_148c + fVar202;
                    uVar39 = 0;
                  }
                  local_14a8._0_4_ = local_14a8._4_4_;
                  fStack_14a0 = (float)local_14a8._4_4_;
                  fStack_149c = (float)local_14a8._4_4_;
                }
                fVar253 = fVar199 - fVar224;
                fVar229 = fVar229 - fVar224;
                fStack_1480 = fStack_1480 - fVar224;
                fStack_147c = fStack_147c - fVar224;
                fVar188 = fVar188 - fVar221;
                fVar198 = fVar198 - fVar221;
                fVar200 = fVar200 - fVar221;
                fVar201 = fVar201 - fVar221;
                fVar126 = *(float *)(ray + k * 4);
                fVar177 = fVar177 - fVar126;
                fVar252 = fVar252 - fVar126;
                fStack_1460 = fStack_1460 - fVar126;
                fStack_145c = fStack_145c - fVar126;
                fVar221 = (float)local_1248 - fVar126;
                fVar224 = local_1248._4_4_ - fVar126;
                fVar178 = fStack_1240 - fVar126;
                fVar185 = fStack_123c - fVar126;
                fVar203 = local_1238 - fVar126;
                fVar230 = fStack_1234 - fVar126;
                fVar211 = fStack_1230 - fVar126;
                fVar126 = fStack_122c - fVar126;
                fVar227 = fVar203 - fVar177;
                fVar228 = fVar230 - fVar252;
                fStack_1340 = fVar211 - fStack_1460;
                fStack_133c = fVar126 - fStack_145c;
                fVar219 = fVar168 - fVar188;
                fVar222 = fVar174 - fVar198;
                fStack_1240 = fVar175 - fVar200;
                fStack_123c = fVar176 - fVar201;
                fVar243 = fVar234 - fVar253;
                fVar246 = fVar245 - fVar229;
                fStack_1230 = fVar248 - fStack_1480;
                fStack_122c = fVar202 - fStack_147c;
                fVar255 = local_1458 - fVar168;
                fVar231 = fStack_1454 - fVar174;
                fVar232 = fStack_1450 - fVar175;
                fVar233 = fStack_144c - fVar176;
                fVar212 = local_1498 - fVar234;
                fVar209 = fStack_1494 - fVar245;
                fVar210 = fStack_1490 - fVar248;
                fVar218 = fStack_148c - fVar202;
                _local_1238 = CONCAT44(fVar246,fVar243);
                fVar244 = fVar177 - fVar221;
                fVar247 = fVar252 - fVar224;
                fVar249 = fStack_1460 - fVar178;
                fVar250 = fStack_145c - fVar185;
                local_1248 = CONCAT44(fVar222,fVar219);
                fVar235 = fVar188 - local_1458;
                fVar237 = fVar198 - fStack_1454;
                fVar239 = fVar200 - fStack_1450;
                fVar241 = fVar201 - fStack_144c;
                fVar220 = fVar253 - local_1498;
                fVar223 = fVar229 - fStack_1494;
                fVar225 = fStack_1480 - fStack_1490;
                fVar226 = fStack_147c - fStack_148c;
                fVar236 = (fVar219 * (fVar234 + fVar253) - (fVar168 + fVar188) * fVar243) *
                          fStack_140c +
                          ((fVar203 + fVar177) * fVar243 - (fVar234 + fVar253) * fVar227) *
                          (float)local_14a8._0_4_ +
                          (fVar227 * (fVar168 + fVar188) - (fVar203 + fVar177) * fVar219) *
                          fStack_14ac;
                fVar238 = (fVar222 * (fVar245 + fVar229) - (fVar174 + fVar198) * fVar246) *
                          fStack_140c +
                          ((fVar230 + fVar252) * fVar246 - (fVar245 + fVar229) * fVar228) *
                          (float)local_14a8._4_4_ +
                          (fVar228 * (fVar174 + fVar198) - (fVar230 + fVar252) * fVar222) *
                          fStack_14ac;
                fVar240 = (fStack_1240 * (fVar248 + fStack_1480) - (fVar175 + fVar200) * fStack_1230
                          ) * fStack_140c +
                          ((fVar211 + fStack_1460) * fStack_1230 -
                          (fVar248 + fStack_1480) * fStack_1340) * fStack_14a0 +
                          (fStack_1340 * (fVar175 + fVar200) - (fVar211 + fStack_1460) * fStack_1240
                          ) * fStack_14ac;
                fVar242 = (fStack_123c * (fVar202 + fStack_147c) - (fVar176 + fVar201) * fStack_122c
                          ) * fStack_140c +
                          ((fVar126 + fStack_145c) * fStack_122c -
                          (fVar202 + fStack_147c) * fStack_133c) * fStack_149c +
                          (fStack_133c * (fVar176 + fVar201) - (fVar126 + fStack_145c) * fStack_123c
                          ) * fStack_14ac;
                fVar245 = fVar221 - fVar203;
                fVar248 = fVar224 - fVar230;
                fVar202 = fVar178 - fVar211;
                fVar168 = fVar185 - fVar126;
                auVar194._0_4_ =
                     (fVar235 * (local_1498 + fVar253) - (local_1458 + fVar188) * fVar220) *
                     fStack_140c +
                     ((fVar177 + fVar221) * fVar220 - (local_1498 + fVar253) * fVar244) *
                     (float)local_14a8._0_4_ +
                     (fVar244 * (local_1458 + fVar188) - (fVar177 + fVar221) * fVar235) *
                     fStack_14ac;
                auVar194._4_4_ =
                     (fVar237 * (fStack_1494 + fVar229) - (fStack_1454 + fVar198) * fVar223) *
                     fStack_140c +
                     ((fVar252 + fVar224) * fVar223 - (fStack_1494 + fVar229) * fVar247) *
                     (float)local_14a8._4_4_ +
                     (fVar247 * (fStack_1454 + fVar198) - (fVar252 + fVar224) * fVar237) *
                     fStack_14ac;
                auVar194._8_4_ =
                     (fVar239 * (fStack_1490 + fStack_1480) - (fStack_1450 + fVar200) * fVar225) *
                     fStack_140c +
                     ((fStack_1460 + fVar178) * fVar225 - (fStack_1490 + fStack_1480) * fVar249) *
                     fStack_14a0 +
                     (fVar249 * (fStack_1450 + fVar200) - (fStack_1460 + fVar178) * fVar239) *
                     fStack_14ac;
                auVar194._12_4_ =
                     (fVar241 * (fStack_148c + fStack_147c) - (fStack_144c + fVar201) * fVar226) *
                     fStack_140c +
                     ((fStack_145c + fVar185) * fVar226 - (fStack_148c + fStack_147c) * fVar250) *
                     fStack_149c +
                     (fVar250 * (fStack_144c + fVar201) - (fStack_145c + fVar185) * fVar241) *
                     fStack_14ac;
                auVar117._0_4_ =
                     (fVar255 * local_1358 - local_1368 * fVar212) * fStack_140c +
                     ((fVar203 + fVar221) * fVar212 - local_1358 * fVar245) *
                     (float)local_14a8._0_4_ +
                     (fVar245 * local_1368 - (fVar203 + fVar221) * fVar255) * fStack_14ac;
                auVar117._4_4_ =
                     (fVar231 * fStack_1354 - fStack_1364 * fVar209) * fStack_140c +
                     ((fVar230 + fVar224) * fVar209 - fStack_1354 * fVar248) *
                     (float)local_14a8._4_4_ +
                     (fVar248 * fStack_1364 - (fVar230 + fVar224) * fVar231) * fStack_14ac;
                auVar117._8_4_ =
                     (fVar232 * fStack_1350 - fStack_1360 * fVar210) * fStack_140c +
                     ((fVar211 + fVar178) * fVar210 - fStack_1350 * fVar202) * fStack_14a0 +
                     (fVar202 * fStack_1360 - (fVar211 + fVar178) * fVar232) * fStack_14ac;
                auVar117._12_4_ =
                     (fVar233 * fStack_134c - fStack_135c * fVar218) * fStack_140c +
                     ((fVar126 + fVar185) * fVar218 - fStack_134c * fVar168) * fStack_149c +
                     (fVar168 * fStack_135c - (fVar126 + fVar185) * fVar233) * fStack_14ac;
                auVar172._0_4_ = fVar236 + auVar194._0_4_ + auVar117._0_4_;
                auVar172._4_4_ = fVar238 + auVar194._4_4_ + auVar117._4_4_;
                auVar172._8_4_ = fVar240 + auVar194._8_4_ + auVar117._8_4_;
                auVar172._12_4_ = fVar242 + auVar194._12_4_ + auVar117._12_4_;
                uVar40 = CONCAT44(auVar172._4_4_,auVar172._0_4_);
                local_1258 = (undefined1  [8])(uVar40 & 0x7fffffff7fffffff);
                fStack_1250 = ABS(auVar172._8_4_);
                fStack_124c = ABS(auVar172._12_4_);
                auVar138._4_4_ = fVar238;
                auVar138._0_4_ = fVar236;
                auVar138._8_4_ = fVar240;
                auVar138._12_4_ = fVar242;
                auVar191 = minps(auVar138,auVar194);
                auVar205 = minps(auVar191,auVar117);
                auVar88._4_4_ = fVar238;
                auVar88._0_4_ = fVar236;
                auVar88._8_4_ = fVar240;
                auVar88._12_4_ = fVar242;
                auVar191 = maxps(auVar88,auVar194);
                auVar191 = maxps(auVar191,auVar117);
                auVar67 = _local_1258;
                auVar89._4_4_ = -(uint)(auVar191._4_4_ <= ABS(auVar172._4_4_) * 1.1920929e-07);
                auVar89._0_4_ = -(uint)(auVar191._0_4_ <= ABS(auVar172._0_4_) * 1.1920929e-07);
                auVar89._8_4_ = -(uint)(auVar191._8_4_ <= fStack_1250 * 1.1920929e-07);
                auVar89._12_4_ = -(uint)(auVar191._12_4_ <= fStack_124c * 1.1920929e-07);
                auVar139._4_4_ = -(uint)(-(ABS(auVar172._4_4_) * 1.1920929e-07) <= auVar205._4_4_);
                auVar139._0_4_ = -(uint)(-(ABS(auVar172._0_4_) * 1.1920929e-07) <= auVar205._0_4_);
                auVar139._8_4_ = -(uint)(-(fStack_1250 * 1.1920929e-07) <= auVar205._8_4_);
                auVar139._12_4_ = -(uint)(-(fStack_124c * 1.1920929e-07) <= auVar205._12_4_);
                auVar89 = auVar89 | auVar139;
                iVar37 = movmskps(uVar39,auVar89);
                uVar40 = local_11d8;
                uVar42 = local_11b8;
                uVar44 = local_11c0;
                uVar46 = local_11d0;
                uVar47 = local_11c8;
                fVar211 = local_1088;
                fVar221 = fStack_1084;
                fVar224 = fStack_1080;
                fVar234 = fStack_107c;
                auVar191 = local_1268;
                auVar205 = local_10a8;
                fVar174 = local_1068;
                fVar175 = fStack_1064;
                fVar176 = fStack_1060;
                fVar203 = fStack_105c;
                fVar178 = local_1078;
                fVar185 = fStack_1074;
                fVar186 = fStack_1070;
                fVar230 = fStack_106c;
                fVar187 = local_1098;
                fVar213 = fStack_1094;
                fVar217 = fStack_1090;
                fVar251 = fStack_108c;
                if (iVar37 != 0) {
                  uVar39 = -(uint)(ABS(fVar255 * fVar220) <= ABS(fVar235 * fVar243));
                  uVar166 = -(uint)(ABS(fVar231 * fVar223) <= ABS(fVar237 * fVar246));
                  uVar49 = -(uint)(ABS(fVar232 * fVar225) <= ABS(fVar239 * fStack_1230));
                  uVar52 = -(uint)(ABS(fVar233 * fVar226) <= ABS(fVar241 * fStack_122c));
                  uVar149 = -(uint)(ABS(fVar244 * fVar212) <= ABS(fVar227 * fVar220));
                  uVar167 = -(uint)(ABS(fVar247 * fVar209) <= ABS(fVar228 * fVar223));
                  uVar50 = -(uint)(ABS(fVar249 * fVar210) <= ABS(fStack_1340 * fVar225));
                  uVar54 = -(uint)(ABS(fVar250 * fVar218) <= ABS(fStack_133c * fVar226));
                  uVar165 = -(uint)(ABS(fVar245 * fVar235) <= ABS(fVar244 * fVar219));
                  uVar48 = -(uint)(ABS(fVar248 * fVar237) <= ABS(fVar247 * fVar222));
                  uVar51 = -(uint)(ABS(fVar202 * fVar239) <= ABS(fVar249 * fStack_1240));
                  uVar55 = -(uint)(ABS(fVar168 * fVar241) <= ABS(fVar250 * fStack_123c));
                  auVar215._0_4_ = (uint)(fVar235 * fVar212 - fVar255 * fVar220) & uVar39;
                  auVar215._4_4_ = (uint)(fVar237 * fVar209 - fVar231 * fVar223) & uVar166;
                  auVar215._8_4_ = (uint)(fVar239 * fVar210 - fVar232 * fVar225) & uVar49;
                  auVar215._12_4_ = (uint)(fVar241 * fVar218 - fVar233 * fVar226) & uVar52;
                  auVar254._0_4_ = ~uVar39 & (uint)(fVar219 * fVar220 - fVar235 * fVar243);
                  auVar254._4_4_ = ~uVar166 & (uint)(fVar222 * fVar223 - fVar237 * fVar246);
                  auVar254._8_4_ = ~uVar49 & (uint)(fStack_1240 * fVar225 - fVar239 * fStack_1230);
                  auVar254._12_4_ = ~uVar52 & (uint)(fStack_123c * fVar226 - fVar241 * fStack_122c);
                  _local_12a8 = auVar254 | auVar215;
                  local_1298[0] =
                       (float)(~uVar149 & (uint)(fVar243 * fVar244 - fVar227 * fVar220) |
                              (uint)(fVar245 * fVar220 - fVar244 * fVar212) & uVar149);
                  local_1298[1] =
                       (float)(~uVar167 & (uint)(fVar246 * fVar247 - fVar228 * fVar223) |
                              (uint)(fVar248 * fVar223 - fVar247 * fVar209) & uVar167);
                  local_1298[2] =
                       (float)(~uVar50 & (uint)(fStack_1230 * fVar249 - fStack_1340 * fVar225) |
                              (uint)(fVar202 * fVar225 - fVar249 * fVar210) & uVar50);
                  local_1298[3] =
                       (float)(~uVar54 & (uint)(fStack_122c * fVar250 - fStack_133c * fVar226) |
                              (uint)(fVar168 * fVar226 - fVar250 * fVar218) & uVar54);
                  local_1288[0] =
                       (float)(~uVar165 & (uint)(fVar227 * fVar235 - fVar244 * fVar219) |
                              (uint)(fVar244 * fVar255 - fVar245 * fVar235) & uVar165);
                  local_1288[1] =
                       (float)(~uVar48 & (uint)(fVar228 * fVar237 - fVar247 * fVar222) |
                              (uint)(fVar247 * fVar231 - fVar248 * fVar237) & uVar48);
                  local_1288[2] =
                       (float)(~uVar51 & (uint)(fStack_1340 * fVar239 - fVar249 * fStack_1240) |
                              (uint)(fVar249 * fVar232 - fVar202 * fVar239) & uVar51);
                  local_1288[3] =
                       (float)(~uVar55 & (uint)(fStack_133c * fVar241 - fVar250 * fStack_123c) |
                              (uint)(fVar250 * fVar233 - fVar168 * fVar241) & uVar55);
                  fVar126 = fStack_140c * local_12a8._0_4_ +
                            (float)local_14a8._0_4_ * local_1298[0] + fStack_14ac * local_1288[0];
                  fVar212 = fStack_140c * local_12a8._4_4_ +
                            (float)local_14a8._4_4_ * local_1298[1] + fStack_14ac * local_1288[1];
                  fVar245 = fStack_140c * local_12a8._8_4_ +
                            fStack_14a0 * local_1298[2] + fStack_14ac * local_1288[2];
                  fVar248 = fStack_140c * local_12a8._12_4_ +
                            fStack_149c * local_1298[3] + fStack_14ac * local_1288[3];
                  auVar182._0_4_ = fVar126 + fVar126;
                  auVar182._4_4_ = fVar212 + fVar212;
                  auVar182._8_4_ = fVar245 + fVar245;
                  auVar182._12_4_ = fVar248 + fVar248;
                  auVar118._0_4_ = fVar188 * local_1298[0] + fVar253 * local_1288[0];
                  auVar118._4_4_ = fVar198 * local_1298[1] + fVar229 * local_1288[1];
                  auVar118._8_4_ = fVar200 * local_1298[2] + fStack_1480 * local_1288[2];
                  auVar118._12_4_ = fVar201 * local_1298[3] + fStack_147c * local_1288[3];
                  fVar198 = fVar177 * local_12a8._0_4_ + auVar118._0_4_;
                  fVar252 = fVar252 * local_12a8._4_4_ + auVar118._4_4_;
                  fVar229 = fStack_1460 * local_12a8._8_4_ + auVar118._8_4_;
                  fVar201 = fStack_145c * local_12a8._12_4_ + auVar118._12_4_;
                  auVar104 = rcpps(auVar118,auVar182);
                  fVar126 = auVar104._0_4_;
                  fVar212 = auVar104._4_4_;
                  fVar177 = auVar104._8_4_;
                  fVar188 = auVar104._12_4_;
                  auVar140._0_4_ =
                       ((1.0 - auVar182._0_4_ * fVar126) * fVar126 + fVar126) * (fVar198 + fVar198);
                  auVar140._4_4_ =
                       ((1.0 - auVar182._4_4_ * fVar212) * fVar212 + fVar212) * (fVar252 + fVar252);
                  auVar140._8_4_ =
                       ((1.0 - auVar182._8_4_ * fVar177) * fVar177 + fVar177) * (fVar229 + fVar229);
                  auVar140._12_4_ =
                       ((1.0 - auVar182._12_4_ * fVar188) * fVar188 + fVar188) * (fVar201 + fVar201)
                  ;
                  fVar212 = *(float *)(ray + k * 4 + 0x80);
                  fVar126 = *(float *)(ray + k * 4 + 0x30);
                  iVar53 = -(uint)(fVar126 <= auVar140._4_4_);
                  iVar57 = -(uint)(fVar126 <= auVar140._8_4_);
                  iVar61 = -(uint)(fVar126 <= auVar140._12_4_);
                  auVar160._8_4_ = iVar57;
                  auVar160._4_4_ = iVar53;
                  auVar160._12_4_ = iVar61;
                  auVar119._0_4_ =
                       -(uint)(auVar140._0_4_ <= fVar212 && fVar126 <= auVar140._0_4_) &
                       auVar89._0_4_;
                  auVar119._4_4_ =
                       -(uint)(auVar140._4_4_ <= fVar212 && fVar126 <= auVar140._4_4_) &
                       auVar89._4_4_;
                  auVar119._8_4_ =
                       -(uint)(auVar140._8_4_ <= fVar212 && fVar126 <= auVar140._8_4_) &
                       auVar89._8_4_;
                  auVar119._12_4_ =
                       -(uint)(auVar140._12_4_ <= fVar212 && fVar126 <= auVar140._12_4_) &
                       auVar89._12_4_;
                  iVar37 = movmskps(iVar37,auVar119);
                  if (iVar37 != 0) {
                    valid.field_0.i[0] = auVar119._0_4_ & -(uint)(auVar182._0_4_ != 0.0);
                    valid.field_0.i[1] = auVar119._4_4_ & -(uint)(auVar182._4_4_ != 0.0);
                    valid.field_0.i[2] = auVar119._8_4_ & -(uint)(auVar182._8_4_ != 0.0);
                    valid.field_0.i[3] = auVar119._12_4_ & -(uint)(auVar182._12_4_ != 0.0);
                    iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
                    if (iVar37 != 0) {
                      _local_12b8 = auVar140;
                      auVar183._0_4_ = auVar172._0_4_ - auVar194._0_4_;
                      auVar183._4_4_ = auVar172._4_4_ - auVar194._4_4_;
                      auVar183._8_4_ = auVar172._8_4_ - auVar194._8_4_;
                      auVar183._12_4_ = auVar172._12_4_ - auVar194._12_4_;
                      auVar160._0_4_ = (float)(int)(*(ushort *)(lVar12 + 8 + lVar41) - 1);
                      auVar195._4_4_ = iVar53;
                      auVar195._0_4_ = auVar160._0_4_;
                      auVar195._8_4_ = iVar57;
                      auVar195._12_4_ = iVar61;
                      auVar104 = rcpss(auVar195,auVar160);
                      fVar126 = (2.0 - auVar160._0_4_ * auVar104._0_4_) * auVar104._0_4_;
                      auVar196._4_12_ = auVar104._4_12_;
                      auVar196._0_4_ = (float)(int)(*(ushort *)(lVar12 + 10 + lVar41) - 1);
                      auVar216._4_4_ = auVar104._4_4_;
                      auVar216._0_4_ = auVar196._0_4_;
                      auVar216._8_4_ = auVar104._8_4_;
                      auVar216._12_4_ = auVar104._12_4_;
                      auVar104 = rcpss(auVar216,auVar196);
                      fVar177 = (2.0 - auVar196._0_4_ * auVar104._0_4_) * auVar104._0_4_;
                      tNear.field_0.v[0] =
                           fVar126 * ((float)sx.field_0.i[0] * auVar172._0_4_ +
                                     (auVar172._0_4_ - fVar236));
                      tNear.field_0.v[1] =
                           fVar126 * ((float)(sx.field_0.i[1] + 1) * auVar172._4_4_ +
                                     (auVar172._4_4_ - fVar238));
                      tNear.field_0.v[2] =
                           fVar126 * ((float)(sx.field_0.i[2] + 1) * auVar172._8_4_ +
                                     (auVar172._8_4_ - fVar240));
                      tNear.field_0.v[3] =
                           fVar126 * ((float)sx.field_0.i[3] * auVar172._12_4_ +
                                     (auVar172._12_4_ - fVar242));
                      pGVar11 = (context->scene->geometries).items[local_1428._0_8_].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar104 = rcpps(auVar183,auVar172);
                        fVar126 = auVar104._0_4_;
                        fVar188 = auVar104._4_4_;
                        fVar252 = auVar104._8_4_;
                        fVar198 = auVar104._12_4_;
                        local_1258._4_4_ = (undefined4)((ulong)local_1258 >> 0x20);
                        fVar126 = (float)(-(uint)(1e-18 <= (float)local_1258._0_4_) &
                                         (uint)(((float)DAT_01f7ba10 - auVar172._0_4_ * fVar126) *
                                                fVar126 + fVar126));
                        fVar188 = (float)(-(uint)(1e-18 <= (float)local_1258._4_4_) &
                                         (uint)((DAT_01f7ba10._4_4_ - auVar172._4_4_ * fVar188) *
                                                fVar188 + fVar188));
                        fVar252 = (float)(-(uint)(1e-18 <= fStack_1250) &
                                         (uint)((DAT_01f7ba10._8_4_ - auVar172._8_4_ * fVar252) *
                                                fVar252 + fVar252));
                        fVar198 = (float)(-(uint)(1e-18 <= fStack_124c) &
                                         (uint)((DAT_01f7ba10._12_4_ - auVar172._12_4_ * fVar198) *
                                                fVar198 + fVar198));
                        auVar90._0_4_ = tNear.field_0.v[0] * fVar126;
                        auVar90._4_4_ = tNear.field_0.v[1] * fVar188;
                        auVar90._8_4_ = tNear.field_0.v[2] * fVar252;
                        auVar90._12_4_ = tNear.field_0.v[3] * fVar198;
                        local_12d8 = minps(auVar90,_DAT_01f7ba10);
                        auVar161._0_4_ =
                             fVar177 * ((float)(int)fVar199 * auVar172._0_4_ + auVar183._0_4_) *
                             fVar126;
                        auVar161._4_4_ =
                             fVar177 * ((float)(int)fVar199 * auVar172._4_4_ + auVar183._4_4_) *
                             fVar188;
                        auVar161._8_4_ =
                             fVar177 * ((float)((int)fVar199 + 1) * auVar172._8_4_ + auVar183._8_4_)
                             * fVar252;
                        auVar161._12_4_ =
                             fVar177 * ((float)((int)fVar199 + 1) * auVar172._12_4_ +
                                       auVar183._12_4_) * fVar198;
                        local_12c8 = minps(auVar161,_DAT_01f7ba10);
                        auVar141._0_4_ = (uint)auVar140._0_4_ & valid.field_0.i[0];
                        auVar141._4_4_ = (uint)auVar140._4_4_ & valid.field_0.i[1];
                        auVar141._8_4_ = (uint)auVar140._8_4_ & valid.field_0.i[2];
                        auVar141._12_4_ = (uint)auVar140._12_4_ & valid.field_0.i[3];
                        auVar162._0_8_ =
                             CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                        auVar162._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                        auVar162._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                        auVar162 = auVar162 | auVar141;
                        auVar142._4_4_ = auVar162._0_4_;
                        auVar142._0_4_ = auVar162._4_4_;
                        auVar142._8_4_ = auVar162._12_4_;
                        auVar142._12_4_ = auVar162._8_4_;
                        auVar104 = minps(auVar142,auVar162);
                        auVar91._0_8_ = auVar104._8_8_;
                        auVar91._8_4_ = auVar104._0_4_;
                        auVar91._12_4_ = auVar104._4_4_;
                        auVar104 = minps(auVar91,auVar104);
                        uVar167 = -(uint)(auVar104._0_4_ == auVar162._0_4_);
                        uVar48 = -(uint)(auVar104._4_4_ == auVar162._4_4_);
                        uVar49 = -(uint)(auVar104._8_4_ == auVar162._8_4_);
                        uVar50 = -(uint)(auVar104._12_4_ == auVar162._12_4_);
                        auVar143._0_4_ = uVar167 & valid.field_0.i[0];
                        auVar143._4_4_ = uVar48 & valid.field_0.i[1];
                        auVar143._8_4_ = uVar49 & valid.field_0.i[2];
                        auVar143._12_4_ = uVar50 & valid.field_0.i[3];
                        iVar37 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar143);
                        uVar39 = 0xffffffff;
                        uVar149 = 0xffffffff;
                        uVar165 = 0xffffffff;
                        uVar166 = 0xffffffff;
                        if (iVar37 != 0) {
                          uVar39 = uVar167;
                          uVar149 = uVar48;
                          uVar165 = uVar49;
                          uVar166 = uVar50;
                        }
                        auVar120._0_4_ = valid.field_0.i[0] & uVar39;
                        auVar120._4_4_ = valid.field_0.i[1] & uVar149;
                        auVar120._8_4_ = valid.field_0.i[2] & uVar165;
                        auVar120._12_4_ = valid.field_0.i[3] & uVar166;
                        uVar39 = movmskps(iVar37,auVar120);
                        lVar33 = 0;
                        if (uVar39 != 0) {
                          for (; (uVar39 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                          }
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar30 = *(undefined4 *)(local_12d8 + lVar33 * 4);
                          uVar7 = *(undefined4 *)(local_12c8 + lVar33 * 4);
                          fVar126 = local_1298[lVar33 + -4];
                          fVar212 = local_1298[lVar33];
                          fVar177 = local_1288[lVar33];
                          *(undefined4 *)(ray + k * 4 + 0x80) =
                               *(undefined4 *)(local_12b8 + lVar33 * 4);
                          *(float *)(ray + k * 4 + 0xc0) = fVar126;
                          *(float *)(ray + k * 4 + 0xd0) = fVar212;
                          *(float *)(ray + k * 4 + 0xe0) = fVar177;
                          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
                          *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
                          *(uint *)(ray + k * 4 + 0x110) = uVar9;
                          *(int *)(ray + k * 4 + 0x120) = (int)local_1428._0_8_;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          uVar7 = local_1158._0_4_;
                          uVar30 = local_1168._0_4_;
                          local_1488 = CONCAT44(local_1168._0_4_,local_1168._0_4_);
                          fStack_1480 = (float)local_1168._0_4_;
                          fStack_147c = (float)local_1168._0_4_;
                          auVar26 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar32);
                          fStack_1460 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar32 + 8);
                          fStack_145c = (float)((ulong)*(undefined8 *)
                                                        (mm_lookupmask_ps + lVar32 + 8) >> 0x20);
                          local_1428 = auVar194;
                          local_1418 = fStack_140c;
                          fStack_1414 = fStack_140c;
                          fStack_1410 = fStack_140c;
                          _local_1258 = auVar67;
                          while( true ) {
                            local_1108 = *(undefined4 *)(local_12d8 + lVar33 * 4);
                            uVar31 = *(undefined4 *)(local_12c8 + lVar33 * 4);
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_12b8 + lVar33 * 4);
                            args.context = context->user;
                            local_10f8._4_4_ = uVar31;
                            local_10f8._0_4_ = uVar31;
                            local_10f8._8_4_ = uVar31;
                            local_10f8._12_4_ = uVar31;
                            local_1138 = local_1298[lVar33 + -4];
                            fVar126 = local_1298[lVar33];
                            fVar203 = local_1288[lVar33];
                            local_1128._4_4_ = fVar126;
                            local_1128._0_4_ = fVar126;
                            fStack_1120 = fVar126;
                            fStack_111c = fVar126;
                            local_1118._4_4_ = fVar203;
                            local_1118._0_4_ = fVar203;
                            fStack_1110 = fVar203;
                            fStack_110c = fVar203;
                            fStack_1134 = local_1138;
                            fStack_1130 = local_1138;
                            fStack_112c = local_1138;
                            uStack_1104 = local_1108;
                            uStack_1100 = local_1108;
                            uStack_10fc = local_1108;
                            local_10e8 = local_1488;
                            uStack_10e0 = CONCAT44(uVar30,uVar30);
                            local_10d8 = CONCAT44(uVar7,uVar7);
                            uStack_10d0 = CONCAT44(uVar7,uVar7);
                            local_10c8 = (args.context)->instID[0];
                            uStack_10c4 = local_10c8;
                            uStack_10c0 = local_10c8;
                            uStack_10bc = local_10c8;
                            local_10b8 = (args.context)->instPrimID[0];
                            uStack_10b4 = local_10b8;
                            uStack_10b0 = local_10b8;
                            uStack_10ac = local_10b8;
                            local_1438._12_4_ = fStack_145c;
                            local_1438._0_12_ = auVar26;
                            args.valid = (int *)local_1438;
                            args.geometryUserPtr = pGVar11->userPtr;
                            args.hit = (RTCHitN *)&local_1138;
                            args.N = 4;
                            p_Var36 = pGVar11->intersectionFilterN;
                            args.ray = (RTCRayN *)ray;
                            if (p_Var36 != (RTCFilterFunctionN)0x0) {
                              p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                            }
                            auVar121._0_4_ = -(uint)(local_1438._0_4_ == 0);
                            auVar121._4_4_ = -(uint)(local_1438._4_4_ == 0);
                            auVar121._8_4_ = -(uint)(local_1438._8_4_ == 0);
                            auVar121._12_4_ = -(uint)(local_1438._12_4_ == 0);
                            uVar39 = movmskps((int)p_Var36,auVar121);
                            pRVar35 = (RTCRayN *)(ulong)(uVar39 ^ 0xf);
                            if ((uVar39 ^ 0xf) == 0) {
                              auVar121 = auVar121 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var36 = context->args->filter;
                              if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&args);
                              }
                              auVar92._0_4_ = -(uint)(local_1438._0_4_ == 0);
                              auVar92._4_4_ = -(uint)(local_1438._4_4_ == 0);
                              auVar92._8_4_ = -(uint)(local_1438._8_4_ == 0);
                              auVar92._12_4_ = -(uint)(local_1438._12_4_ == 0);
                              auVar121 = auVar92 ^ _DAT_01f7ae20;
                              uVar39 = movmskps((int)p_Var36,auVar92);
                              pRVar35 = (RTCRayN *)(ulong)(uVar39 ^ 0xf);
                              if ((uVar39 ^ 0xf) != 0) {
                                auVar144._0_4_ = *(uint *)(args.ray + 0xc0) & auVar92._0_4_;
                                auVar144._4_4_ = *(uint *)(args.ray + 0xc4) & auVar92._4_4_;
                                auVar144._8_4_ = *(uint *)(args.ray + 200) & auVar92._8_4_;
                                auVar144._12_4_ = *(uint *)(args.ray + 0xcc) & auVar92._12_4_;
                                auVar197._0_4_ = ~auVar92._0_4_ & *(uint *)args.hit;
                                auVar197._4_4_ = ~auVar92._4_4_ & *(uint *)(args.hit + 4);
                                auVar197._8_4_ = ~auVar92._8_4_ & *(uint *)(args.hit + 8);
                                auVar197._12_4_ = ~auVar92._12_4_ & *(uint *)(args.hit + 0xc);
                                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar197 | auVar144;
                                uVar39 = *(uint *)(args.hit + 0x14);
                                uVar9 = *(uint *)(args.hit + 0x18);
                                uVar149 = *(uint *)(args.hit + 0x1c);
                                *(uint *)(args.ray + 0xd0) =
                                     ~auVar92._0_4_ & *(uint *)(args.hit + 0x10) |
                                     *(uint *)(args.ray + 0xd0) & auVar92._0_4_;
                                *(uint *)(args.ray + 0xd4) =
                                     ~auVar92._4_4_ & uVar39 |
                                     *(uint *)(args.ray + 0xd4) & auVar92._4_4_;
                                *(uint *)(args.ray + 0xd8) =
                                     ~auVar92._8_4_ & uVar9 |
                                     *(uint *)(args.ray + 0xd8) & auVar92._8_4_;
                                *(uint *)(args.ray + 0xdc) =
                                     ~auVar92._12_4_ & uVar149 |
                                     *(uint *)(args.ray + 0xdc) & auVar92._12_4_;
                                auVar173._0_4_ = *(uint *)(args.ray + 0xe0) & auVar92._0_4_;
                                auVar173._4_4_ = *(uint *)(args.ray + 0xe4) & auVar92._4_4_;
                                auVar173._8_4_ = *(uint *)(args.ray + 0xe8) & auVar92._8_4_;
                                auVar173._12_4_ = *(uint *)(args.ray + 0xec) & auVar92._12_4_;
                                auVar145._0_4_ = ~auVar92._0_4_ & *(uint *)(args.hit + 0x20);
                                auVar145._4_4_ = ~auVar92._4_4_ & *(uint *)(args.hit + 0x24);
                                auVar145._8_4_ = ~auVar92._8_4_ & *(uint *)(args.hit + 0x28);
                                auVar145._12_4_ = ~auVar92._12_4_ & *(uint *)(args.hit + 0x2c);
                                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar145 | auVar173;
                                auVar184._0_4_ = *(uint *)(args.ray + 0xf0) & auVar92._0_4_;
                                auVar184._4_4_ = *(uint *)(args.ray + 0xf4) & auVar92._4_4_;
                                auVar184._8_4_ = *(uint *)(args.ray + 0xf8) & auVar92._8_4_;
                                auVar184._12_4_ = *(uint *)(args.ray + 0xfc) & auVar92._12_4_;
                                auVar146._0_4_ = ~auVar92._0_4_ & *(uint *)(args.hit + 0x30);
                                auVar146._4_4_ = ~auVar92._4_4_ & *(uint *)(args.hit + 0x34);
                                auVar146._8_4_ = ~auVar92._8_4_ & *(uint *)(args.hit + 0x38);
                                auVar146._12_4_ = ~auVar92._12_4_ & *(uint *)(args.hit + 0x3c);
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar146 | auVar184;
                                uVar39 = *(uint *)(args.hit + 0x44);
                                uVar9 = *(uint *)(args.hit + 0x48);
                                uVar149 = *(uint *)(args.hit + 0x4c);
                                *(uint *)(args.ray + 0x100) =
                                     ~auVar92._0_4_ & *(uint *)(args.hit + 0x40) |
                                     *(uint *)(args.ray + 0x100) & auVar92._0_4_;
                                *(uint *)(args.ray + 0x104) =
                                     ~auVar92._4_4_ & uVar39 |
                                     *(uint *)(args.ray + 0x104) & auVar92._4_4_;
                                *(uint *)(args.ray + 0x108) =
                                     ~auVar92._8_4_ & uVar9 |
                                     *(uint *)(args.ray + 0x108) & auVar92._8_4_;
                                *(uint *)(args.ray + 0x10c) =
                                     ~auVar92._12_4_ & uVar149 |
                                     *(uint *)(args.ray + 0x10c) & auVar92._12_4_;
                                uVar39 = *(uint *)(args.hit + 0x54);
                                uVar9 = *(uint *)(args.hit + 0x58);
                                uVar149 = *(uint *)(args.hit + 0x5c);
                                *(uint *)(args.ray + 0x110) =
                                     *(uint *)(args.ray + 0x110) & auVar92._0_4_ |
                                     ~auVar92._0_4_ & *(uint *)(args.hit + 0x50);
                                *(uint *)(args.ray + 0x114) =
                                     *(uint *)(args.ray + 0x114) & auVar92._4_4_ |
                                     ~auVar92._4_4_ & uVar39;
                                *(uint *)(args.ray + 0x118) =
                                     *(uint *)(args.ray + 0x118) & auVar92._8_4_ |
                                     ~auVar92._8_4_ & uVar9;
                                *(uint *)(args.ray + 0x11c) =
                                     *(uint *)(args.ray + 0x11c) & auVar92._12_4_ |
                                     ~auVar92._12_4_ & uVar149;
                                uVar39 = *(uint *)(args.hit + 100);
                                uVar9 = *(uint *)(args.hit + 0x68);
                                uVar149 = *(uint *)(args.hit + 0x6c);
                                *(uint *)(args.ray + 0x120) =
                                     *(uint *)(args.ray + 0x120) & auVar92._0_4_ |
                                     ~auVar92._0_4_ & *(uint *)(args.hit + 0x60);
                                *(uint *)(args.ray + 0x124) =
                                     *(uint *)(args.ray + 0x124) & auVar92._4_4_ |
                                     ~auVar92._4_4_ & uVar39;
                                *(uint *)(args.ray + 0x128) =
                                     *(uint *)(args.ray + 0x128) & auVar92._8_4_ |
                                     ~auVar92._8_4_ & uVar9;
                                *(uint *)(args.ray + 300) =
                                     *(uint *)(args.ray + 300) & auVar92._12_4_ |
                                     ~auVar92._12_4_ & uVar149;
                                auVar147._0_4_ = *(uint *)(args.ray + 0x130) & auVar92._0_4_;
                                auVar147._4_4_ = *(uint *)(args.ray + 0x134) & auVar92._4_4_;
                                auVar147._8_4_ = *(uint *)(args.ray + 0x138) & auVar92._8_4_;
                                auVar147._12_4_ = *(uint *)(args.ray + 0x13c) & auVar92._12_4_;
                                auVar163._0_4_ = ~auVar92._0_4_ & *(uint *)(args.hit + 0x70);
                                auVar163._4_4_ = ~auVar92._4_4_ & *(uint *)(args.hit + 0x74);
                                auVar163._8_4_ = ~auVar92._8_4_ & *(uint *)(args.hit + 0x78);
                                auVar163._12_4_ = ~auVar92._12_4_ & *(uint *)(args.hit + 0x7c);
                                *(undefined1 (*) [16])(args.ray + 0x130) = auVar163 | auVar147;
                                *(undefined1 (*) [16])(args.ray + 0x140) =
                                     ~auVar92 & *(undefined1 (*) [16])(args.hit + 0x80) |
                                     *(undefined1 (*) [16])(args.ray + 0x140) & auVar92;
                                pRVar35 = args.ray;
                              }
                            }
                            auVar122._0_4_ = auVar121._0_4_ << 0x1f;
                            auVar122._4_4_ = auVar121._4_4_ << 0x1f;
                            auVar122._8_4_ = auVar121._8_4_ << 0x1f;
                            auVar122._12_4_ = auVar121._12_4_ << 0x1f;
                            iVar37 = movmskps((int)pRVar35,auVar122);
                            if (iVar37 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar212;
                            }
                            else {
                              fVar212 = *(float *)(ray + k * 4 + 0x80);
                            }
                            *(undefined4 *)(local_1438 + lVar33 * 4 + -0x10) = 0;
                            valid.field_0.i[0] =
                                 -(uint)(auVar140._0_4_ <= fVar212) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(auVar140._4_4_ <= fVar212) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(auVar140._8_4_ <= fVar212) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(auVar140._12_4_ <= fVar212) & valid.field_0.i[3];
                            iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
                            uVar40 = local_11d8;
                            uVar42 = local_11b8;
                            uVar44 = local_11c0;
                            uVar46 = local_11d0;
                            uVar47 = local_11c8;
                            fVar211 = local_1088;
                            fVar221 = fStack_1084;
                            fVar224 = fStack_1080;
                            fVar234 = fStack_107c;
                            auVar191 = local_1268;
                            auVar205 = local_10a8;
                            fVar174 = local_1068;
                            fVar175 = fStack_1064;
                            fVar176 = fStack_1060;
                            fVar203 = fStack_105c;
                            fVar178 = local_1078;
                            fVar185 = fStack_1074;
                            fVar186 = fStack_1070;
                            fVar230 = fStack_106c;
                            fVar187 = local_1098;
                            fVar213 = fStack_1094;
                            fVar217 = fStack_1090;
                            fVar251 = fStack_108c;
                            if (iVar37 == 0) break;
                            auVar123._0_4_ = valid.field_0.i[0] & (uint)auVar140._0_4_;
                            auVar123._4_4_ = valid.field_0.i[1] & (uint)auVar140._4_4_;
                            auVar123._8_4_ = valid.field_0.i[2] & (uint)auVar140._8_4_;
                            auVar123._12_4_ = valid.field_0.i[3] & (uint)auVar140._12_4_;
                            auVar148._0_8_ =
                                 CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                 0x7f8000007f800000;
                            auVar148._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                            auVar148._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                            auVar148 = auVar148 | auVar123;
                            auVar164._4_4_ = auVar148._0_4_;
                            auVar164._0_4_ = auVar148._4_4_;
                            auVar164._8_4_ = auVar148._12_4_;
                            auVar164._12_4_ = auVar148._8_4_;
                            auVar191 = minps(auVar164,auVar148);
                            auVar124._0_8_ = auVar191._8_8_;
                            auVar124._8_4_ = auVar191._0_4_;
                            auVar124._12_4_ = auVar191._4_4_;
                            auVar191 = minps(auVar124,auVar191);
                            auVar125._0_8_ =
                                 CONCAT44(-(uint)(auVar191._4_4_ == auVar148._4_4_) &
                                          valid.field_0.i[1],
                                          -(uint)(auVar191._0_4_ == auVar148._0_4_) &
                                          valid.field_0.i[0]);
                            auVar125._8_4_ =
                                 -(uint)(auVar191._8_4_ == auVar148._8_4_) & valid.field_0.i[2];
                            auVar125._12_4_ =
                                 -(uint)(auVar191._12_4_ == auVar148._12_4_) & valid.field_0.i[3];
                            iVar37 = movmskps(iVar37,auVar125);
                            aVar93 = valid.field_0;
                            if (iVar37 != 0) {
                              aVar93.i[2] = auVar125._8_4_;
                              aVar93._0_8_ = auVar125._0_8_;
                              aVar93.i[3] = auVar125._12_4_;
                            }
                            uVar31 = movmskps(iVar37,(undefined1  [16])aVar93);
                            uVar40 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar31);
                            lVar33 = 0;
                            if (uVar40 != 0) {
                              for (; (uVar40 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_11a8 = local_11a8 & local_11a8 - 1;
            } while (local_11a8 != 0);
          }
          local_11e0 = local_11e0 + 1;
        } while (local_11e0 != local_11e8);
      }
      uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar191._4_4_ = uVar30;
      auVar191._0_4_ = uVar30;
      auVar191._8_4_ = uVar30;
      auVar191._12_4_ = uVar30;
      fVar198 = local_1188;
      fVar229 = fStack_1184;
      fVar201 = fStack_1180;
      fVar177 = fStack_117c;
      fVar126 = local_1278;
      fVar188 = fStack_1274;
      fVar199 = fStack_1270;
      fVar252 = fStack_126c;
      fVar200 = local_1198;
      fVar245 = fStack_1194;
      fVar248 = fStack_1190;
      fVar202 = fStack_118c;
      fVar209 = local_1178;
      fVar210 = fStack_1174;
      fVar168 = fStack_1170;
      fVar212 = fStack_116c;
    }
    if (local_1220 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }